

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  byte bVar65;
  byte bVar66;
  uint uVar67;
  byte bVar68;
  long lVar69;
  uint uVar70;
  uint uVar71;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ulong uVar72;
  bool bVar73;
  uint uVar74;
  bool bVar75;
  ulong uVar76;
  ulong uVar77;
  undefined1 auVar87 [16];
  uint uVar78;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  uint uVar139;
  float pp;
  float fVar140;
  undefined1 auVar142 [16];
  float fVar141;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar156;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar157 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar223;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar221;
  float fVar222;
  float fVar224;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar237;
  float fVar245;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  undefined1 auVar242 [64];
  float fVar246;
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  float s;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_a3c;
  undefined1 local_9c0 [16];
  undefined4 local_9b0;
  uint local_9ac;
  float local_9a8;
  float local_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  RTCHitN local_540 [16];
  undefined1 auStack_530 [16];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  uint local_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  uint uStack_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar113 [32];
  undefined1 auVar128 [32];
  undefined1 auVar132 [32];
  
  PVar2 = prim[1];
  uVar72 = (ulong)(byte)PVar2;
  fVar141 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar86 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar225 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar197 = fVar141 * auVar225._0_4_;
  fVar140 = fVar141 * auVar86._0_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar82);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar79);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar84);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar96 = vcvtdq2ps_avx(auVar100);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar72 + 6);
  auVar95 = vpmovsxbd_avx2(auVar80);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar76 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar76 + uVar72 + 6);
  auVar98 = vpmovsxbd_avx2(auVar238);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar77 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar90 = vpmovsxbd_avx2(auVar1);
  auVar99 = vcvtdq2ps_avx(auVar90);
  auVar109._4_4_ = fVar140;
  auVar109._0_4_ = fVar140;
  auVar109._8_4_ = fVar140;
  auVar109._12_4_ = fVar140;
  auVar109._16_4_ = fVar140;
  auVar109._20_4_ = fVar140;
  auVar109._24_4_ = fVar140;
  auVar109._28_4_ = fVar140;
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = ZEXT1632(CONCAT412(fVar141 * auVar86._12_4_,
                                CONCAT48(fVar141 * auVar86._8_4_,
                                         CONCAT44(fVar141 * auVar86._4_4_,fVar140))));
  auVar101 = vpermps_avx2(auVar111,auVar102);
  auVar89 = vpermps_avx512vl(auVar88,auVar102);
  fVar140 = auVar89._0_4_;
  fVar198 = auVar89._4_4_;
  auVar102._4_4_ = fVar198 * auVar92._4_4_;
  auVar102._0_4_ = fVar140 * auVar92._0_4_;
  fVar211 = auVar89._8_4_;
  auVar102._8_4_ = fVar211 * auVar92._8_4_;
  fVar212 = auVar89._12_4_;
  auVar102._12_4_ = fVar212 * auVar92._12_4_;
  fVar213 = auVar89._16_4_;
  auVar102._16_4_ = fVar213 * auVar92._16_4_;
  fVar214 = auVar89._20_4_;
  auVar102._20_4_ = fVar214 * auVar92._20_4_;
  fVar215 = auVar89._24_4_;
  auVar102._24_4_ = fVar215 * auVar92._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar95._4_4_ * fVar198;
  auVar100._0_4_ = auVar95._0_4_ * fVar140;
  auVar100._8_4_ = auVar95._8_4_ * fVar211;
  auVar100._12_4_ = auVar95._12_4_ * fVar212;
  auVar100._16_4_ = auVar95._16_4_ * fVar213;
  auVar100._20_4_ = auVar95._20_4_ * fVar214;
  auVar100._24_4_ = auVar95._24_4_ * fVar215;
  auVar100._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar99._4_4_ * fVar198;
  auVar90._0_4_ = auVar99._0_4_ * fVar140;
  auVar90._8_4_ = auVar99._8_4_ * fVar211;
  auVar90._12_4_ = auVar99._12_4_ * fVar212;
  auVar90._16_4_ = auVar99._16_4_ * fVar213;
  auVar90._20_4_ = auVar99._20_4_ * fVar214;
  auVar90._24_4_ = auVar99._24_4_ * fVar215;
  auVar90._28_4_ = auVar89._28_4_;
  auVar81 = vfmadd231ps_fma(auVar102,auVar101,auVar91);
  auVar82 = vfmadd231ps_fma(auVar100,auVar101,auVar96);
  auVar79 = vfmadd231ps_fma(auVar90,auVar98,auVar101);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar109,auVar94);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar109,auVar93);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar97,auVar109);
  auVar110._4_4_ = fVar197;
  auVar110._0_4_ = fVar197;
  auVar110._8_4_ = fVar197;
  auVar110._12_4_ = fVar197;
  auVar110._16_4_ = fVar197;
  auVar110._20_4_ = fVar197;
  auVar110._24_4_ = fVar197;
  auVar110._28_4_ = fVar197;
  auVar90 = ZEXT1632(CONCAT412(fVar141 * auVar225._12_4_,
                               CONCAT48(fVar141 * auVar225._8_4_,
                                        CONCAT44(fVar141 * auVar225._4_4_,fVar197))));
  auVar100 = vpermps_avx2(auVar111,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar141 = auVar90._0_4_;
  fVar140 = auVar90._4_4_;
  auVar101._4_4_ = fVar140 * auVar92._4_4_;
  auVar101._0_4_ = fVar141 * auVar92._0_4_;
  fVar198 = auVar90._8_4_;
  auVar101._8_4_ = fVar198 * auVar92._8_4_;
  fVar211 = auVar90._12_4_;
  auVar101._12_4_ = fVar211 * auVar92._12_4_;
  fVar212 = auVar90._16_4_;
  auVar101._16_4_ = fVar212 * auVar92._16_4_;
  fVar213 = auVar90._20_4_;
  auVar101._20_4_ = fVar213 * auVar92._20_4_;
  fVar214 = auVar90._24_4_;
  auVar101._24_4_ = fVar214 * auVar92._24_4_;
  auVar101._28_4_ = 1;
  auVar88._4_4_ = auVar95._4_4_ * fVar140;
  auVar88._0_4_ = auVar95._0_4_ * fVar141;
  auVar88._8_4_ = auVar95._8_4_ * fVar198;
  auVar88._12_4_ = auVar95._12_4_ * fVar211;
  auVar88._16_4_ = auVar95._16_4_ * fVar212;
  auVar88._20_4_ = auVar95._20_4_ * fVar213;
  auVar88._24_4_ = auVar95._24_4_ * fVar214;
  auVar88._28_4_ = auVar92._28_4_;
  auVar95._4_4_ = auVar99._4_4_ * fVar140;
  auVar95._0_4_ = auVar99._0_4_ * fVar141;
  auVar95._8_4_ = auVar99._8_4_ * fVar198;
  auVar95._12_4_ = auVar99._12_4_ * fVar211;
  auVar95._16_4_ = auVar99._16_4_ * fVar212;
  auVar95._20_4_ = auVar99._20_4_ * fVar213;
  auVar95._24_4_ = auVar99._24_4_ * fVar214;
  auVar95._28_4_ = auVar90._28_4_;
  auVar83 = vfmadd231ps_fma(auVar101,auVar100,auVar91);
  auVar84 = vfmadd231ps_fma(auVar88,auVar100,auVar96);
  auVar80 = vfmadd231ps_fma(auVar95,auVar100,auVar98);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar110,auVar94);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,auVar93);
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar110,auVar97);
  auVar94 = vandps_avx(ZEXT1632(auVar81),auVar107);
  auVar108._8_4_ = 0x219392ef;
  auVar108._0_8_ = 0x219392ef219392ef;
  auVar108._12_4_ = 0x219392ef;
  auVar108._16_4_ = 0x219392ef;
  auVar108._20_4_ = 0x219392ef;
  auVar108._24_4_ = 0x219392ef;
  auVar108._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar94,auVar108,1);
  bVar73 = (bool)((byte)uVar76 & 1);
  auVar89._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar81._0_4_;
  bVar73 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar81._4_4_;
  bVar73 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar81._8_4_;
  bVar73 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar81._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar82),auVar107);
  uVar76 = vcmpps_avx512vl(auVar94,auVar108,1);
  bVar73 = (bool)((byte)uVar76 & 1);
  auVar103._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar82._0_4_;
  bVar73 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar82._4_4_;
  bVar73 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar82._8_4_;
  bVar73 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar82._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar79),auVar107);
  uVar76 = vcmpps_avx512vl(auVar94,auVar108,1);
  bVar73 = (bool)((byte)uVar76 & 1);
  auVar94._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._0_4_;
  bVar73 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._4_4_;
  bVar73 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._8_4_;
  bVar73 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar79._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar264 = ZEXT3264(auVar92);
  auVar93 = vfnmadd213ps_avx512vl(auVar89,auVar91,auVar92);
  auVar81 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar103);
  auVar93 = vfnmadd213ps_avx512vl(auVar103,auVar91,auVar92);
  auVar82 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar94);
  auVar94 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar92);
  auVar79 = vfmadd132ps_fma(auVar94,auVar91,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar83));
  auVar97._4_4_ = auVar81._4_4_ * auVar94._4_4_;
  auVar97._0_4_ = auVar81._0_4_ * auVar94._0_4_;
  auVar97._8_4_ = auVar81._8_4_ * auVar94._8_4_;
  auVar97._12_4_ = auVar81._12_4_ * auVar94._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar83));
  auVar95 = vpbroadcastd_avx512vl();
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar106._0_4_ = auVar81._0_4_ * auVar94._0_4_;
  auVar106._4_4_ = auVar81._4_4_ * auVar94._4_4_;
  auVar106._8_4_ = auVar81._8_4_ * auVar94._8_4_;
  auVar106._12_4_ = auVar81._12_4_ * auVar94._12_4_;
  auVar106._16_4_ = auVar94._16_4_ * 0.0;
  auVar106._20_4_ = auVar94._20_4_ * 0.0;
  auVar106._24_4_ = auVar94._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar72 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
  auVar98._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar98._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar98._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar94._16_4_ * 0.0;
  auVar98._20_4_ = auVar94._20_4_ * 0.0;
  auVar98._24_4_ = auVar94._24_4_ * 0.0;
  auVar98._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar91);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
  auVar105._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar105._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar105._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar105._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + uVar72 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar80));
  auVar99._4_4_ = auVar94._4_4_ * auVar79._4_4_;
  auVar99._0_4_ = auVar94._0_4_ * auVar79._0_4_;
  auVar99._8_4_ = auVar94._8_4_ * auVar79._8_4_;
  auVar99._12_4_ = auVar94._12_4_ * auVar79._12_4_;
  auVar99._16_4_ = auVar94._16_4_ * 0.0;
  auVar99._20_4_ = auVar94._20_4_ * 0.0;
  auVar99._24_4_ = auVar94._24_4_ * 0.0;
  auVar99._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar80));
  auVar104._0_4_ = auVar79._0_4_ * auVar94._0_4_;
  auVar104._4_4_ = auVar79._4_4_ * auVar94._4_4_;
  auVar104._8_4_ = auVar79._8_4_ * auVar94._8_4_;
  auVar104._12_4_ = auVar79._12_4_ * auVar94._12_4_;
  auVar104._16_4_ = auVar94._16_4_ * 0.0;
  auVar104._20_4_ = auVar94._20_4_ * 0.0;
  auVar104._24_4_ = auVar94._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar97,auVar106);
  auVar91 = vpminsd_avx2(auVar98,auVar105);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91 = vpminsd_avx2(auVar99,auVar104);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar92._4_4_ = uVar156;
  auVar92._0_4_ = uVar156;
  auVar92._8_4_ = uVar156;
  auVar92._12_4_ = uVar156;
  auVar92._16_4_ = uVar156;
  auVar92._20_4_ = uVar156;
  auVar92._24_4_ = uVar156;
  auVar92._28_4_ = uVar156;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar94,auVar91);
  auVar94 = vpmaxsd_avx2(auVar97,auVar106);
  auVar91 = vpmaxsd_avx2(auVar98,auVar105);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar91 = vpmaxsd_avx2(auVar99,auVar104);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar156;
  auVar93._0_4_ = uVar156;
  auVar93._8_4_ = uVar156;
  auVar93._12_4_ = uVar156;
  auVar93._16_4_ = uVar156;
  auVar93._20_4_ = uVar156;
  auVar93._24_4_ = uVar156;
  auVar93._28_4_ = uVar156;
  auVar91 = vminps_avx512vl(auVar91,auVar93);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar96);
  uVar13 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar12 = vcmpps_avx512vl(local_340,auVar94,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) == 0) {
    return false;
  }
  local_608 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  local_570 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = prim;
LAB_01d114d4:
  lVar69 = 0;
  for (uVar76 = local_608; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar69 = lVar69 + 1;
  }
  uVar74 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar74].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar69 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar69 = *(long *)&pGVar3[1].time_range.upper;
  auVar81 = *(undefined1 (*) [16])(lVar69 + (long)p_Var4 * uVar76);
  auVar82 = *(undefined1 (*) [16])(lVar69 + (uVar76 + 1) * (long)p_Var4);
  local_608 = local_608 - 1 & local_608;
  if (local_608 != 0) {
    uVar72 = local_608 - 1 & local_608;
    for (uVar77 = local_608; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar249._4_4_ = uVar156;
  auVar249._0_4_ = uVar156;
  auVar249._8_4_ = uVar156;
  auVar249._12_4_ = uVar156;
  local_460._16_4_ = uVar156;
  local_460._0_16_ = auVar249;
  local_460._20_4_ = uVar156;
  local_460._24_4_ = uVar156;
  local_460._28_4_ = uVar156;
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar252._4_4_ = uVar156;
  auVar252._0_4_ = uVar156;
  auVar252._8_4_ = uVar156;
  auVar252._12_4_ = uVar156;
  local_480._16_4_ = uVar156;
  local_480._0_16_ = auVar252;
  local_480._20_4_ = uVar156;
  local_480._24_4_ = uVar156;
  local_480._28_4_ = uVar156;
  auVar79 = vunpcklps_avx(auVar249,auVar252);
  fVar141 = *(float *)(ray + k * 4 + 0x60);
  auVar253._4_4_ = fVar141;
  auVar253._0_4_ = fVar141;
  auVar253._8_4_ = fVar141;
  auVar253._12_4_ = fVar141;
  local_4a0._16_4_ = fVar141;
  local_4a0._0_16_ = auVar253;
  local_4a0._20_4_ = fVar141;
  local_4a0._24_4_ = fVar141;
  local_4a0._28_4_ = fVar141;
  local_710 = vinsertps_avx(auVar79,auVar253,0x28);
  auVar225._0_4_ = auVar81._0_4_ + auVar82._0_4_;
  auVar225._4_4_ = auVar81._4_4_ + auVar82._4_4_;
  auVar225._8_4_ = auVar81._8_4_ + auVar82._8_4_;
  auVar225._12_4_ = auVar81._12_4_ + auVar82._12_4_;
  auVar86._8_4_ = 0x3f000000;
  auVar86._0_8_ = 0x3f0000003f000000;
  auVar86._12_4_ = 0x3f000000;
  auVar79 = vmulps_avx512vl(auVar225,auVar86);
  auVar79 = vsubps_avx(auVar79,auVar83);
  auVar79 = vdpps_avx(auVar79,local_710,0x7f);
  fVar140 = *(float *)(ray + k * 4 + 0x30);
  auVar247 = ZEXT464((uint)fVar140);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar248 = ZEXT1664(local_720);
  auVar229._4_12_ = ZEXT812(0) << 0x20;
  auVar229._0_4_ = local_720._0_4_;
  auVar80 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar229);
  auVar84 = vfnmadd213ss_fma(auVar80,local_720,ZEXT416(0x40000000));
  local_320 = auVar79._0_4_ * auVar80._0_4_ * auVar84._0_4_;
  auVar230._4_4_ = local_320;
  auVar230._0_4_ = local_320;
  auVar230._8_4_ = local_320;
  auVar230._12_4_ = local_320;
  fStack_990 = local_320;
  _local_9a0 = auVar230;
  fStack_98c = local_320;
  fStack_988 = local_320;
  fStack_984 = local_320;
  auVar79 = vfmadd231ps_fma(auVar83,local_710,auVar230);
  auVar79 = vblendps_avx(auVar79,ZEXT816(0) << 0x40,8);
  auVar81 = vsubps_avx(auVar81,auVar79);
  auVar83 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + (uVar76 + 2) * (long)p_Var4),auVar79);
  auVar236 = ZEXT1664(auVar83);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar242 = ZEXT1664(auVar82);
  auVar79 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + (uVar76 + 3) * (long)p_Var4),auVar79);
  local_920 = vbroadcastss_avx512vl(auVar81);
  auVar254 = ZEXT3264(local_920);
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar81);
  local_940 = vpermps_avx512vl(auVar115,local_6a0);
  auVar255 = ZEXT3264(local_940);
  auVar116._8_4_ = 2;
  auVar116._0_8_ = 0x200000002;
  auVar116._12_4_ = 2;
  auVar116._16_4_ = 2;
  auVar116._20_4_ = 2;
  auVar116._24_4_ = 2;
  auVar116._28_4_ = 2;
  local_820 = vpermps_avx512vl(auVar116,local_6a0);
  auVar256 = ZEXT3264(local_820);
  auVar117._8_4_ = 3;
  auVar117._0_8_ = 0x300000003;
  auVar117._12_4_ = 3;
  auVar117._16_4_ = 3;
  auVar117._20_4_ = 3;
  auVar117._24_4_ = 3;
  auVar117._28_4_ = 3;
  local_960 = vpermps_avx512vl(auVar117,local_6a0);
  auVar257 = ZEXT3264(local_960);
  local_840 = vbroadcastss_avx512vl(auVar82);
  auVar258 = ZEXT3264(local_840);
  local_6e0 = ZEXT1632(auVar82);
  local_980 = vpermps_avx512vl(auVar115,local_6e0);
  auVar259 = ZEXT3264(local_980);
  local_860 = vpermps_avx512vl(auVar116,local_6e0);
  auVar260 = ZEXT3264(local_860);
  local_8e0 = vpermps_avx512vl(auVar117,local_6e0);
  auVar261 = ZEXT3264(local_8e0);
  local_900 = vbroadcastss_avx512vl(auVar83);
  auVar262 = ZEXT3264(local_900);
  local_6c0 = ZEXT1632(auVar83);
  local_880 = vpermps_avx512vl(auVar115,local_6c0);
  auVar263 = ZEXT3264(local_880);
  local_2a0 = vpermps_avx512vl(auVar116,local_6c0);
  local_220 = vpermps_avx2(auVar117,local_6c0);
  uVar156 = auVar79._0_4_;
  local_2c0._4_4_ = uVar156;
  local_2c0._0_4_ = uVar156;
  local_2c0._8_4_ = uVar156;
  local_2c0._12_4_ = uVar156;
  local_2c0._16_4_ = uVar156;
  local_2c0._20_4_ = uVar156;
  local_2c0._24_4_ = uVar156;
  local_2c0._28_4_ = uVar156;
  _local_700 = ZEXT1632(auVar79);
  local_280 = vpermps_avx512vl(auVar115,_local_700);
  local_240 = vpermps_avx2(auVar116,_local_700);
  local_300 = vpermps_avx2(auVar117,_local_700);
  auVar81 = vfmadd231ps_fma(ZEXT432((uint)(fVar141 * fVar141)),local_480,local_480);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_460,local_460);
  local_260._0_4_ = auVar81._0_4_;
  local_260._4_4_ = local_260._0_4_;
  local_260._8_4_ = local_260._0_4_;
  local_260._12_4_ = local_260._0_4_;
  local_260._16_4_ = local_260._0_4_;
  local_260._20_4_ = local_260._0_4_;
  local_260._24_4_ = local_260._0_4_;
  local_260._28_4_ = local_260._0_4_;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_260,auVar112);
  local_650 = ZEXT416((uint)local_320);
  local_320 = fVar140 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_550 = vpbroadcastd_avx512vl();
  local_a3c = 1;
  uVar70 = 0;
  bVar73 = false;
  local_560 = vpbroadcastd_avx512vl();
  auVar81 = vsqrtss_avx(local_720,local_720);
  local_9a4 = auVar81._0_4_;
  auVar81 = vsqrtss_avx(local_720,local_720);
  local_9a8 = auVar81._0_4_;
  local_3f0 = ZEXT816(0x3f80000000000000);
  local_2e0 = local_280;
  do {
    auVar81 = vmovshdup_avx(local_3f0);
    auVar81 = vsubps_avx(auVar81,local_3f0);
    local_8c0._0_4_ = auVar81._0_4_;
    fVar141 = local_8c0._0_4_ * 0.04761905;
    uVar156 = local_3f0._0_4_;
    local_8a0._4_4_ = uVar156;
    local_8a0._0_4_ = uVar156;
    local_8a0._8_4_ = uVar156;
    local_8a0._12_4_ = uVar156;
    local_8a0._16_4_ = uVar156;
    local_8a0._20_4_ = uVar156;
    local_8a0._24_4_ = uVar156;
    local_8a0._28_4_ = uVar156;
    local_8c0._4_4_ = local_8c0._0_4_;
    local_8c0._8_4_ = local_8c0._0_4_;
    local_8c0._12_4_ = local_8c0._0_4_;
    local_8c0._16_4_ = local_8c0._0_4_;
    local_8c0._20_4_ = local_8c0._0_4_;
    local_8c0._24_4_ = local_8c0._0_4_;
    local_8c0._28_4_ = local_8c0._0_4_;
    auVar81 = vfmadd231ps_fma(local_8a0,local_8c0,_DAT_01faff20);
    auVar111 = auVar264._0_32_;
    auVar94 = vsubps_avx512vl(auVar111,ZEXT1632(auVar81));
    fVar198 = auVar81._0_4_;
    fVar211 = auVar81._4_4_;
    fVar212 = auVar81._8_4_;
    fVar213 = auVar81._12_4_;
    fVar215 = auVar94._0_4_;
    fVar197 = auVar94._4_4_;
    fVar216 = auVar94._8_4_;
    fVar221 = auVar94._12_4_;
    fVar222 = auVar94._16_4_;
    fVar223 = auVar94._20_4_;
    fVar224 = auVar94._24_4_;
    auVar36._4_4_ = fVar197 * fVar197 * -fVar211;
    auVar36._0_4_ = fVar215 * fVar215 * -fVar198;
    auVar36._8_4_ = fVar216 * fVar216 * -fVar212;
    auVar36._12_4_ = fVar221 * fVar221 * -fVar213;
    auVar36._16_4_ = fVar222 * fVar222 * -0.0;
    auVar36._20_4_ = fVar223 * fVar223 * -0.0;
    auVar36._24_4_ = fVar224 * fVar224 * -0.0;
    auVar36._28_4_ = 0x80000000;
    auVar236._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * fVar213,
                            CONCAT48(fVar212 * fVar212,CONCAT44(fVar211 * fVar211,fVar198 * fVar198)
                                    )));
    fVar237 = fVar198 * 3.0;
    fVar243 = fVar211 * 3.0;
    fVar244 = fVar212 * 3.0;
    fVar245 = fVar213 * 3.0;
    auVar232._28_36_ = auVar242._28_36_;
    auVar232._0_28_ = ZEXT1628(CONCAT412(fVar245,CONCAT48(fVar244,CONCAT44(fVar243,fVar237))));
    fVar246 = auVar242._28_4_ + -5.0;
    auVar168._0_4_ = (fVar237 + -5.0) * fVar198 * fVar198 + 2.0;
    auVar168._4_4_ = (fVar243 + -5.0) * fVar211 * fVar211 + 2.0;
    auVar168._8_4_ = (fVar244 + -5.0) * fVar212 * fVar212 + 2.0;
    auVar168._12_4_ = (fVar245 + -5.0) * fVar213 * fVar213 + 2.0;
    auVar168._16_4_ = 0x40000000;
    auVar168._20_4_ = 0x40000000;
    auVar168._24_4_ = 0x40000000;
    auVar168._28_4_ = 0x40000000;
    auVar242._0_4_ = fVar215 * fVar215;
    auVar242._4_4_ = fVar197 * fVar197;
    auVar242._8_4_ = fVar216 * fVar216;
    auVar242._12_4_ = fVar221 * fVar221;
    auVar242._16_4_ = fVar222 * fVar222;
    auVar242._20_4_ = fVar223 * fVar223;
    auVar242._28_36_ = auVar247._28_36_;
    auVar242._24_4_ = fVar224 * fVar224;
    auVar191._0_4_ = auVar242._0_4_ * (fVar215 * 3.0 + -5.0) + 2.0;
    auVar191._4_4_ = auVar242._4_4_ * (fVar197 * 3.0 + -5.0) + 2.0;
    auVar191._8_4_ = auVar242._8_4_ * (fVar216 * 3.0 + -5.0) + 2.0;
    auVar191._12_4_ = auVar242._12_4_ * (fVar221 * 3.0 + -5.0) + 2.0;
    auVar191._16_4_ = auVar242._16_4_ * (fVar222 * 3.0 + -5.0) + 2.0;
    auVar191._20_4_ = auVar242._20_4_ * (fVar223 * 3.0 + -5.0) + 2.0;
    auVar191._24_4_ = auVar242._24_4_ * (fVar224 * 3.0 + -5.0) + 2.0;
    auVar191._28_4_ = auVar248._28_4_ + -5.0 + 2.0;
    fVar214 = auVar94._28_4_;
    auVar37._4_4_ = fVar211 * fVar211 * -fVar197;
    auVar37._0_4_ = fVar198 * fVar198 * -fVar215;
    auVar37._8_4_ = fVar212 * fVar212 * -fVar216;
    auVar37._12_4_ = fVar213 * fVar213 * -fVar221;
    auVar37._16_4_ = -fVar222 * 0.0 * 0.0;
    auVar37._20_4_ = -fVar223 * 0.0 * 0.0;
    auVar37._24_4_ = -fVar224 * 0.0 * 0.0;
    auVar37._28_4_ = -fVar214;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar94 = vmulps_avx512vl(auVar36,auVar93);
    auVar96 = vmulps_avx512vl(auVar168,auVar93);
    auVar91 = vmulps_avx512vl(auVar191,auVar93);
    auVar92 = vmulps_avx512vl(auVar37,auVar93);
    auVar95 = vmulps_avx512vl(local_2c0,auVar92);
    auVar97 = vmulps_avx512vl(local_2e0,auVar92);
    auVar98 = vmulps_avx512vl(local_240,auVar92);
    auVar38._4_4_ = local_300._4_4_ * auVar92._4_4_;
    auVar38._0_4_ = local_300._0_4_ * auVar92._0_4_;
    auVar38._8_4_ = local_300._8_4_ * auVar92._8_4_;
    auVar38._12_4_ = local_300._12_4_ * auVar92._12_4_;
    auVar38._16_4_ = local_300._16_4_ * auVar92._16_4_;
    auVar38._20_4_ = local_300._20_4_ * auVar92._20_4_;
    auVar38._24_4_ = local_300._24_4_ * auVar92._24_4_;
    auVar38._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar262._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar91,auVar263._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar91,local_2a0);
    auVar91 = vfmadd231ps_avx512vl(auVar38,local_220,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar258._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar259._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar260._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar261._0_32_,auVar96);
    local_5a0 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar254._0_32_);
    local_680 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar255._0_32_);
    local_7e0 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar256._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar91,auVar257._0_32_,auVar94);
    auVar39._4_4_ = (fVar197 + fVar197) * fVar211;
    auVar39._0_4_ = (fVar215 + fVar215) * fVar198;
    auVar39._8_4_ = (fVar216 + fVar216) * fVar212;
    auVar39._12_4_ = (fVar221 + fVar221) * fVar213;
    auVar39._16_4_ = (fVar222 + fVar222) * 0.0;
    auVar39._20_4_ = (fVar223 + fVar223) * 0.0;
    auVar39._24_4_ = (fVar224 + fVar224) * 0.0;
    auVar39._28_4_ = auVar96._28_4_;
    auVar94 = vsubps_avx(auVar39,auVar242._0_32_);
    auVar219._0_28_ =
         ZEXT1628(CONCAT412((fVar213 + fVar213) * (fVar245 + -5.0) + fVar245 * fVar213,
                            CONCAT48((fVar212 + fVar212) * (fVar244 + -5.0) + fVar244 * fVar212,
                                     CONCAT44((fVar211 + fVar211) * (fVar243 + -5.0) +
                                              fVar243 * fVar211,
                                              (fVar198 + fVar198) * (fVar237 + -5.0) +
                                              fVar237 * fVar198))));
    auVar219._28_4_ = fVar246 + 0.0;
    auVar118._8_4_ = 0x40000000;
    auVar118._0_8_ = 0x4000000040000000;
    auVar118._12_4_ = 0x40000000;
    auVar118._16_4_ = 0x40000000;
    auVar118._20_4_ = 0x40000000;
    auVar118._24_4_ = 0x40000000;
    auVar118._28_4_ = 0x40000000;
    auVar91 = vaddps_avx512vl(auVar232._0_32_,auVar118);
    auVar40._4_4_ = (fVar197 + fVar197) * auVar91._4_4_;
    auVar40._0_4_ = (fVar215 + fVar215) * auVar91._0_4_;
    auVar40._8_4_ = (fVar216 + fVar216) * auVar91._8_4_;
    auVar40._12_4_ = (fVar221 + fVar221) * auVar91._12_4_;
    auVar40._16_4_ = (fVar222 + fVar222) * auVar91._16_4_;
    auVar40._20_4_ = (fVar223 + fVar223) * auVar91._20_4_;
    auVar40._24_4_ = (fVar224 + fVar224) * auVar91._24_4_;
    auVar40._28_4_ = auVar91._28_4_;
    auVar41._4_4_ = fVar197 * 3.0 * fVar197;
    auVar41._0_4_ = fVar215 * 3.0 * fVar215;
    auVar41._8_4_ = fVar216 * 3.0 * fVar216;
    auVar41._12_4_ = fVar221 * 3.0 * fVar221;
    auVar41._16_4_ = fVar222 * 3.0 * fVar222;
    auVar41._20_4_ = fVar223 * 3.0 * fVar223;
    auVar41._24_4_ = fVar224 * 3.0 * fVar224;
    auVar41._28_4_ = fVar214;
    auVar91 = vsubps_avx(auVar40,auVar41);
    auVar92 = vsubps_avx(auVar236._0_32_,auVar39);
    auVar94 = vmulps_avx512vl(auVar94,auVar93);
    auVar97 = vmulps_avx512vl(auVar219,auVar93);
    auVar91 = vmulps_avx512vl(auVar91,auVar93);
    auVar92 = vmulps_avx512vl(auVar92,auVar93);
    auVar42._4_4_ = local_2c0._4_4_ * auVar92._4_4_;
    auVar42._0_4_ = local_2c0._0_4_ * auVar92._0_4_;
    auVar42._8_4_ = local_2c0._8_4_ * auVar92._8_4_;
    auVar42._12_4_ = local_2c0._12_4_ * auVar92._12_4_;
    auVar42._16_4_ = local_2c0._16_4_ * auVar92._16_4_;
    auVar42._20_4_ = local_2c0._20_4_ * auVar92._20_4_;
    auVar42._24_4_ = local_2c0._24_4_ * auVar92._24_4_;
    auVar42._28_4_ = fVar246;
    auVar93 = vmulps_avx512vl(local_2e0,auVar92);
    auVar98 = vmulps_avx512vl(local_240,auVar92);
    auVar43._4_4_ = local_300._4_4_ * auVar92._4_4_;
    auVar43._0_4_ = local_300._0_4_ * auVar92._0_4_;
    auVar43._8_4_ = local_300._8_4_ * auVar92._8_4_;
    auVar43._12_4_ = local_300._12_4_ * auVar92._12_4_;
    auVar43._16_4_ = local_300._16_4_ * auVar92._16_4_;
    auVar43._20_4_ = local_300._20_4_ * auVar92._20_4_;
    auVar43._24_4_ = local_300._24_4_ * auVar92._24_4_;
    auVar43._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar42,auVar91,auVar262._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar263._0_32_);
    auVar81 = vfmadd231ps_fma(auVar98,auVar91,local_2a0);
    auVar91 = vfmadd231ps_avx512vl(auVar43,local_220,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar258._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar259._0_32_);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar97,auVar260._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar261._0_32_,auVar97);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar254._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,auVar255._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar256._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar91,auVar257._0_32_,auVar94);
    auVar44._4_4_ = auVar92._4_4_ * fVar141;
    auVar44._0_4_ = auVar92._0_4_ * fVar141;
    auVar44._8_4_ = auVar92._8_4_ * fVar141;
    auVar44._12_4_ = auVar92._12_4_ * fVar141;
    auVar44._16_4_ = auVar92._16_4_ * fVar141;
    auVar44._20_4_ = auVar92._20_4_ * fVar141;
    auVar44._24_4_ = auVar92._24_4_ * fVar141;
    auVar44._28_4_ = fVar214 + fVar214;
    auVar45._4_4_ = auVar93._4_4_ * fVar141;
    auVar45._0_4_ = auVar93._0_4_ * fVar141;
    auVar45._8_4_ = auVar93._8_4_ * fVar141;
    auVar45._12_4_ = auVar93._12_4_ * fVar141;
    auVar45._16_4_ = auVar93._16_4_ * fVar141;
    auVar45._20_4_ = auVar93._20_4_ * fVar141;
    auVar45._24_4_ = auVar93._24_4_ * fVar141;
    auVar45._28_4_ = auVar96._28_4_;
    auVar46._4_4_ = auVar97._4_4_ * fVar141;
    auVar46._0_4_ = auVar97._0_4_ * fVar141;
    auVar46._8_4_ = auVar97._8_4_ * fVar141;
    auVar46._12_4_ = auVar97._12_4_ * fVar141;
    auVar46._16_4_ = auVar97._16_4_ * fVar141;
    auVar46._20_4_ = auVar97._20_4_ * fVar141;
    auVar46._24_4_ = auVar97._24_4_ * fVar141;
    auVar46._28_4_ = 0;
    fVar198 = fVar141 * auVar94._0_4_;
    fVar211 = fVar141 * auVar94._4_4_;
    auVar47._4_4_ = fVar211;
    auVar47._0_4_ = fVar198;
    fVar212 = fVar141 * auVar94._8_4_;
    auVar47._8_4_ = fVar212;
    fVar213 = fVar141 * auVar94._12_4_;
    auVar47._12_4_ = fVar213;
    fVar214 = fVar141 * auVar94._16_4_;
    auVar47._16_4_ = fVar214;
    fVar215 = fVar141 * auVar94._20_4_;
    auVar47._20_4_ = fVar215;
    fVar197 = fVar141 * auVar94._24_4_;
    auVar47._24_4_ = fVar197;
    auVar47._28_4_ = fVar141;
    auVar81 = vxorps_avx512vl(auVar261._0_16_,auVar261._0_16_);
    auVar96 = vpermt2ps_avx512vl(local_5a0,_DAT_01feed00,ZEXT1632(auVar81));
    auVar97 = vpermt2ps_avx512vl(local_680,_DAT_01feed00,ZEXT1632(auVar81));
    auVar247 = ZEXT3264(auVar97);
    auVar92 = ZEXT1632(auVar81);
    auVar98 = vpermt2ps_avx512vl(local_7e0,_DAT_01feed00,auVar92);
    auVar248 = ZEXT3264(auVar98);
    auVar220._0_4_ = auVar95._0_4_ + fVar198;
    auVar220._4_4_ = auVar95._4_4_ + fVar211;
    auVar220._8_4_ = auVar95._8_4_ + fVar212;
    auVar220._12_4_ = auVar95._12_4_ + fVar213;
    auVar220._16_4_ = auVar95._16_4_ + fVar214;
    auVar220._20_4_ = auVar95._20_4_ + fVar215;
    auVar220._24_4_ = auVar95._24_4_ + fVar197;
    auVar220._28_4_ = auVar95._28_4_ + fVar141;
    auVar94 = vmaxps_avx(auVar95,auVar220);
    auVar91 = vminps_avx(auVar95,auVar220);
    auVar95 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar92);
    auVar99 = vpermt2ps_avx512vl(auVar44,_DAT_01feed00,auVar92);
    auVar242 = ZEXT3264(auVar99);
    auVar100 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar92);
    auVar110 = ZEXT1632(auVar81);
    auVar90 = vpermt2ps_avx512vl(auVar46,_DAT_01feed00,auVar110);
    auVar92 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar110);
    auVar101 = vsubps_avx512vl(auVar95,auVar92);
    auVar102 = vsubps_avx512vl(auVar96,local_5a0);
    auVar236 = ZEXT3264(auVar102);
    auVar92 = vsubps_avx(auVar97,local_680);
    auVar93 = vsubps_avx(auVar98,local_7e0);
    auVar88 = vmulps_avx512vl(auVar92,auVar46);
    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar45,auVar93);
    auVar89 = vmulps_avx512vl(auVar93,auVar44);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar46,auVar102);
    auVar103 = vmulps_avx512vl(auVar102,auVar45);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar44,auVar92);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar89 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar88);
    auVar89 = vmulps_avx512vl(auVar93,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,auVar92);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,auVar102);
    auVar103 = vrcp14ps_avx512vl(auVar89);
    auVar104 = vfnmadd213ps_avx512vl(auVar103,auVar89,auVar111);
    auVar103 = vfmadd132ps_avx512vl(auVar104,auVar103,auVar103);
    auVar88 = vmulps_avx512vl(auVar88,auVar103);
    auVar104 = vmulps_avx512vl(auVar92,auVar90);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar100,auVar93);
    auVar105 = vmulps_avx512vl(auVar93,auVar99);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar90,auVar102);
    auVar106 = vmulps_avx512vl(auVar102,auVar100);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar99,auVar92);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar88 = vmaxps_avx512vl(auVar88,auVar103);
    auVar88 = vsqrtps_avx512vl(auVar88);
    auVar103 = vmaxps_avx512vl(auVar101,auVar95);
    auVar94 = vmaxps_avx512vl(auVar94,auVar103);
    auVar103 = vaddps_avx512vl(auVar88,auVar94);
    auVar94 = vminps_avx512vl(auVar101,auVar95);
    auVar94 = vminps_avx(auVar91,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar88);
    auVar24._8_4_ = 0x3f800002;
    auVar24._0_8_ = 0x3f8000023f800002;
    auVar24._12_4_ = 0x3f800002;
    auVar24._16_4_ = 0x3f800002;
    auVar24._20_4_ = 0x3f800002;
    auVar24._24_4_ = 0x3f800002;
    auVar24._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar103,auVar24);
    auVar25._8_4_ = 0x3f7ffffc;
    auVar25._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar25._12_4_ = 0x3f7ffffc;
    auVar25._16_4_ = 0x3f7ffffc;
    auVar25._20_4_ = 0x3f7ffffc;
    auVar25._24_4_ = 0x3f7ffffc;
    auVar25._28_4_ = 0x3f7ffffc;
    auVar94 = vmulps_avx512vl(auVar94,auVar25);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar95 = vrsqrt14ps_avx512vl(auVar89);
    auVar26._8_4_ = 0xbf000000;
    auVar26._0_8_ = 0xbf000000bf000000;
    auVar26._12_4_ = 0xbf000000;
    auVar26._16_4_ = 0xbf000000;
    auVar26._20_4_ = 0xbf000000;
    auVar26._24_4_ = 0xbf000000;
    auVar26._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar89,auVar26);
    fVar141 = auVar95._0_4_;
    fVar198 = auVar95._4_4_;
    fVar211 = auVar95._8_4_;
    fVar212 = auVar95._12_4_;
    fVar213 = auVar95._16_4_;
    fVar214 = auVar95._20_4_;
    fVar215 = auVar95._24_4_;
    auVar48._4_4_ = fVar198 * fVar198 * fVar198 * auVar101._4_4_;
    auVar48._0_4_ = fVar141 * fVar141 * fVar141 * auVar101._0_4_;
    auVar48._8_4_ = fVar211 * fVar211 * fVar211 * auVar101._8_4_;
    auVar48._12_4_ = fVar212 * fVar212 * fVar212 * auVar101._12_4_;
    auVar48._16_4_ = fVar213 * fVar213 * fVar213 * auVar101._16_4_;
    auVar48._20_4_ = fVar214 * fVar214 * fVar214 * auVar101._20_4_;
    auVar48._24_4_ = fVar215 * fVar215 * fVar215 * auVar101._24_4_;
    auVar48._28_4_ = auVar103._28_4_;
    auVar27._8_4_ = 0x3fc00000;
    auVar27._0_8_ = 0x3fc000003fc00000;
    auVar27._12_4_ = 0x3fc00000;
    auVar27._16_4_ = 0x3fc00000;
    auVar27._20_4_ = 0x3fc00000;
    auVar27._24_4_ = 0x3fc00000;
    auVar27._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar48,auVar95,auVar27);
    auVar101 = vmulps_avx512vl(auVar102,auVar95);
    auVar88 = vmulps_avx512vl(auVar92,auVar95);
    auVar89 = vmulps_avx512vl(auVar93,auVar95);
    auVar103 = vsubps_avx512vl(auVar110,local_5a0);
    auVar104 = vsubps_avx512vl(auVar110,local_680);
    auVar105 = vsubps_avx512vl(auVar110,local_7e0);
    auVar106 = vmulps_avx512vl(local_4a0,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_480,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_460,auVar103);
    auVar107 = vmulps_avx512vl(auVar105,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar103);
    auVar108 = vmulps_avx512vl(local_4a0,auVar89);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar88,local_480);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,local_460);
    auVar89 = vmulps_avx512vl(auVar105,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar104,auVar88);
    auVar101 = vfmadd231ps_avx512vl(auVar88,auVar103,auVar101);
    auVar88 = vmulps_avx512vl(auVar108,auVar108);
    auVar89 = vsubps_avx512vl(local_260,auVar88);
    auVar109 = vmulps_avx512vl(auVar108,auVar101);
    auVar106 = vsubps_avx512vl(auVar106,auVar109);
    auVar106 = vaddps_avx512vl(auVar106,auVar106);
    auVar109 = vmulps_avx512vl(auVar101,auVar101);
    local_5e0 = vsubps_avx512vl(auVar107,auVar109);
    auVar91 = vsubps_avx512vl(local_5e0,auVar91);
    local_5c0 = vmulps_avx512vl(auVar106,auVar106);
    auVar28._8_4_ = 0x40800000;
    auVar28._0_8_ = 0x4080000040800000;
    auVar28._12_4_ = 0x40800000;
    auVar28._16_4_ = 0x40800000;
    auVar28._20_4_ = 0x40800000;
    auVar28._24_4_ = 0x40800000;
    auVar28._28_4_ = 0x40800000;
    _local_800 = vmulps_avx512vl(auVar89,auVar28);
    auVar107 = vmulps_avx512vl(_local_800,auVar91);
    auVar107 = vsubps_avx512vl(local_5c0,auVar107);
    uVar76 = vcmpps_avx512vl(auVar107,auVar110,5);
    bVar64 = (byte)uVar76;
    fVar141 = (float)local_9a0._0_4_;
    fVar198 = (float)local_9a0._4_4_;
    fVar211 = fStack_998;
    fVar212 = fStack_994;
    fVar213 = fStack_990;
    fVar214 = fStack_98c;
    fVar215 = fStack_988;
    fVar197 = fStack_984;
    if (bVar64 == 0) {
LAB_01d121fe:
      auVar254 = ZEXT3264(local_920);
      auVar255 = ZEXT3264(local_940);
      auVar256 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_960);
      auVar258 = ZEXT3264(local_840);
      auVar259 = ZEXT3264(local_980);
      auVar260 = ZEXT3264(local_860);
      auVar261 = ZEXT3264(local_8e0);
      auVar262 = ZEXT3264(local_900);
      auVar263 = ZEXT3264(local_880);
    }
    else {
      auVar107 = vsqrtps_avx512vl(auVar107);
      auVar109 = vaddps_avx512vl(auVar89,auVar89);
      local_600 = vrcp14ps_avx512vl(auVar109);
      auVar110 = vfnmadd213ps_avx512vl(local_600,auVar109,auVar111);
      auVar110 = vfmadd132ps_avx512vl(auVar110,local_600,local_600);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      local_740 = vxorps_avx512vl(auVar106,auVar29);
      auVar111 = vsubps_avx512vl(local_740,auVar107);
      auVar111 = vmulps_avx512vl(auVar111,auVar110);
      auVar107 = vsubps_avx512vl(auVar107,auVar106);
      auVar107 = vmulps_avx512vl(auVar107,auVar110);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar112 = vblendmps_avx512vl(auVar110,auVar111);
      auVar113._0_4_ =
           (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar110._0_4_;
      bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar75 * auVar112._4_4_ | (uint)!bVar75 * auVar110._4_4_;
      bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar75 * auVar112._8_4_ | (uint)!bVar75 * auVar110._8_4_;
      bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar75 * auVar112._12_4_ | (uint)!bVar75 * auVar110._12_4_;
      bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar75 * auVar112._16_4_ | (uint)!bVar75 * auVar110._16_4_;
      bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar75 * auVar112._20_4_ | (uint)!bVar75 * auVar110._20_4_;
      bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar75 * auVar112._24_4_ | (uint)!bVar75 * auVar110._24_4_;
      bVar75 = SUB81(uVar76 >> 7,0);
      auVar113._28_4_ = (uint)bVar75 * auVar112._28_4_ | (uint)!bVar75 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar110,auVar107);
      auVar114._0_4_ =
           (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar110._0_4_;
      bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar75 * auVar112._4_4_ | (uint)!bVar75 * auVar110._4_4_;
      bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar75 * auVar112._8_4_ | (uint)!bVar75 * auVar110._8_4_;
      bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar75 * auVar112._12_4_ | (uint)!bVar75 * auVar110._12_4_;
      bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar75 * auVar112._16_4_ | (uint)!bVar75 * auVar110._16_4_;
      bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar75 * auVar112._20_4_ | (uint)!bVar75 * auVar110._20_4_;
      bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar75 * auVar112._24_4_ | (uint)!bVar75 * auVar110._24_4_;
      bVar75 = SUB81(uVar76 >> 7,0);
      auVar114._28_4_ = (uint)bVar75 * auVar112._28_4_ | (uint)!bVar75 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar88,auVar110);
      auVar88 = vmaxps_avx512vl(local_280,auVar110);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_760 = vmulps_avx512vl(auVar88,auVar30);
      vandps_avx512vl(auVar89,auVar110);
      uVar77 = vcmpps_avx512vl(local_760,local_760,1);
      uVar76 = uVar76 & uVar77;
      bVar68 = (byte)uVar76;
      if (bVar68 != 0) {
        uVar77 = vcmpps_avx512vl(auVar91,_DAT_01faff00,2);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar110 = vblendmps_avx512vl(auVar91,auVar89);
        bVar66 = (byte)uVar77;
        uVar78 = (uint)(bVar66 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar66 & 1) * local_760._0_4_;
        bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar71 = (uint)bVar75 * auVar110._4_4_ | (uint)!bVar75 * local_760._4_4_;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar67 = (uint)bVar75 * auVar110._8_4_ | (uint)!bVar75 * local_760._8_4_;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar134 = (uint)bVar75 * auVar110._12_4_ | (uint)!bVar75 * local_760._12_4_;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar135 = (uint)bVar75 * auVar110._16_4_ | (uint)!bVar75 * local_760._16_4_;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar136 = (uint)bVar75 * auVar110._20_4_ | (uint)!bVar75 * local_760._20_4_;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar137 = (uint)bVar75 * auVar110._24_4_ | (uint)!bVar75 * local_760._24_4_;
        bVar75 = SUB81(uVar77 >> 7,0);
        uVar138 = (uint)bVar75 * auVar110._28_4_ | (uint)!bVar75 * local_760._28_4_;
        auVar113._0_4_ = (bVar68 & 1) * uVar78 | !(bool)(bVar68 & 1) * auVar113._0_4_;
        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar113._4_4_ = bVar75 * uVar71 | !bVar75 * auVar113._4_4_;
        bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar113._8_4_ = bVar75 * uVar67 | !bVar75 * auVar113._8_4_;
        bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar113._12_4_ = bVar75 * uVar134 | !bVar75 * auVar113._12_4_;
        bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar113._16_4_ = bVar75 * uVar135 | !bVar75 * auVar113._16_4_;
        bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar113._20_4_ = bVar75 * uVar136 | !bVar75 * auVar113._20_4_;
        bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar113._24_4_ = bVar75 * uVar137 | !bVar75 * auVar113._24_4_;
        bVar75 = SUB81(uVar76 >> 7,0);
        auVar113._28_4_ = bVar75 * uVar138 | !bVar75 * auVar113._28_4_;
        auVar91 = vblendmps_avx512vl(auVar89,auVar91);
        bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar11 = SUB81(uVar77 >> 7,0);
        auVar114._0_4_ =
             (uint)(bVar68 & 1) *
             ((uint)(bVar66 & 1) * auVar91._0_4_ | !(bool)(bVar66 & 1) * uVar78) |
             !(bool)(bVar68 & 1) * auVar114._0_4_;
        bVar5 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar114._4_4_ =
             (uint)bVar5 * ((uint)bVar75 * auVar91._4_4_ | !bVar75 * uVar71) |
             !bVar5 * auVar114._4_4_;
        bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar114._8_4_ =
             (uint)bVar75 * ((uint)bVar6 * auVar91._8_4_ | !bVar6 * uVar67) |
             !bVar75 * auVar114._8_4_;
        bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar114._12_4_ =
             (uint)bVar75 * ((uint)bVar7 * auVar91._12_4_ | !bVar7 * uVar134) |
             !bVar75 * auVar114._12_4_;
        bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar114._16_4_ =
             (uint)bVar75 * ((uint)bVar8 * auVar91._16_4_ | !bVar8 * uVar135) |
             !bVar75 * auVar114._16_4_;
        bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar114._20_4_ =
             (uint)bVar75 * ((uint)bVar9 * auVar91._20_4_ | !bVar9 * uVar136) |
             !bVar75 * auVar114._20_4_;
        bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar114._24_4_ =
             (uint)bVar75 * ((uint)bVar10 * auVar91._24_4_ | !bVar10 * uVar137) |
             !bVar75 * auVar114._24_4_;
        bVar75 = SUB81(uVar76 >> 7,0);
        auVar114._28_4_ =
             (uint)bVar75 * ((uint)bVar11 * auVar91._28_4_ | !bVar11 * uVar138) |
             !bVar75 * auVar114._28_4_;
        bVar64 = (~bVar68 | bVar66) & bVar64;
      }
      if ((bVar64 & 0x7f) == 0) {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar264 = ZEXT3264(auVar94);
        goto LAB_01d121fe;
      }
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar90 = vxorps_avx512vl(auVar90,auVar91);
      auVar99 = vxorps_avx512vl(auVar99,auVar91);
      uVar78 = *(uint *)(ray + k * 4 + 0x80);
      auVar100 = vxorps_avx512vl(auVar100,auVar91);
      local_7c0 = ZEXT416(uVar78);
      auVar81 = vsubss_avx512f(local_7c0,ZEXT416((uint)local_650._0_4_));
      auVar89 = vbroadcastss_avx512vl(auVar81);
      auVar89 = vminps_avx512vl(auVar89,auVar114);
      auVar63._4_4_ = fStack_31c;
      auVar63._0_4_ = local_320;
      auVar63._8_4_ = fStack_318;
      auVar63._12_4_ = fStack_314;
      auVar63._16_4_ = fStack_310;
      auVar63._20_4_ = fStack_30c;
      auVar63._24_4_ = fStack_308;
      auVar63._28_4_ = fStack_304;
      auVar110 = vmaxps_avx512vl(auVar63,auVar113);
      auVar105 = vmulps_avx512vl(auVar105,auVar46);
      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar45,auVar105);
      auVar81 = vfmadd213ps_fma(auVar103,auVar44,auVar104);
      auVar103 = vmulps_avx512vl(local_4a0,auVar46);
      auVar82 = vfmadd231ps_fma(auVar103,local_480,auVar45);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),local_460,auVar44);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar104);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar104,auVar105,1);
      auVar112 = vxorps_avx512vl(ZEXT1632(auVar81),auVar91);
      auVar115 = vrcp14ps_avx512vl(auVar103);
      auVar116 = vxorps_avx512vl(auVar103,auVar91);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar118 = vfnmadd213ps_avx512vl(auVar115,auVar103,auVar117);
      auVar81 = vfmadd132ps_fma(auVar118,auVar115,auVar115);
      fVar216 = auVar81._0_4_ * auVar112._0_4_;
      fVar221 = auVar81._4_4_ * auVar112._4_4_;
      auVar49._4_4_ = fVar221;
      auVar49._0_4_ = fVar216;
      fVar222 = auVar81._8_4_ * auVar112._8_4_;
      auVar49._8_4_ = fVar222;
      fVar223 = auVar81._12_4_ * auVar112._12_4_;
      auVar49._12_4_ = fVar223;
      fVar224 = auVar112._16_4_ * 0.0;
      auVar49._16_4_ = fVar224;
      fVar237 = auVar112._20_4_ * 0.0;
      auVar49._20_4_ = fVar237;
      fVar243 = auVar112._24_4_ * 0.0;
      auVar49._24_4_ = fVar243;
      auVar49._28_4_ = auVar112._28_4_;
      uVar13 = vcmpps_avx512vl(auVar103,auVar116,1);
      bVar68 = (byte)uVar12 | (byte)uVar13;
      auVar192._8_4_ = 0xff800000;
      auVar192._0_8_ = 0xff800000ff800000;
      auVar192._12_4_ = 0xff800000;
      auVar192._16_4_ = 0xff800000;
      auVar192._20_4_ = 0xff800000;
      auVar192._24_4_ = 0xff800000;
      auVar192._28_4_ = 0xff800000;
      auVar118 = vblendmps_avx512vl(auVar49,auVar192);
      auVar119._0_4_ =
           (uint)(bVar68 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar115._0_4_;
      bVar75 = (bool)(bVar68 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar75 * auVar118._4_4_ | (uint)!bVar75 * auVar115._4_4_;
      bVar75 = (bool)(bVar68 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar75 * auVar118._8_4_ | (uint)!bVar75 * auVar115._8_4_;
      bVar75 = (bool)(bVar68 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar75 * auVar118._12_4_ | (uint)!bVar75 * auVar115._12_4_;
      bVar75 = (bool)(bVar68 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar75 * auVar118._16_4_ | (uint)!bVar75 * auVar115._16_4_;
      bVar75 = (bool)(bVar68 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar75 * auVar118._20_4_ | (uint)!bVar75 * auVar115._20_4_;
      bVar75 = (bool)(bVar68 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar75 * auVar118._24_4_ | (uint)!bVar75 * auVar115._24_4_;
      auVar119._28_4_ =
           (uint)(bVar68 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar115._28_4_;
      auVar115 = vmaxps_avx512vl(auVar110,auVar119);
      uVar13 = vcmpps_avx512vl(auVar103,auVar116,6);
      bVar68 = (byte)uVar12 | (byte)uVar13;
      auVar120._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar216;
      bVar75 = (bool)(bVar68 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar221;
      bVar75 = (bool)(bVar68 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar222;
      bVar75 = (bool)(bVar68 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar223;
      bVar75 = (bool)(bVar68 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar224;
      bVar75 = (bool)(bVar68 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar237;
      bVar75 = (bool)(bVar68 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar243;
      auVar120._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar112._28_4_;
      auVar89 = vminps_avx512vl(auVar89,auVar120);
      auVar81 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar81),auVar96);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
      auVar103 = ZEXT1632(auVar81);
      auVar98 = vsubps_avx512vl(auVar103,auVar98);
      auVar98 = vmulps_avx512vl(auVar98,auVar90);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar97);
      auVar96 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar96);
      auVar97 = vmulps_avx512vl(local_4a0,auVar90);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_480,auVar100);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_460,auVar99);
      vandps_avx512vl(auVar97,auVar104);
      uVar12 = vcmpps_avx512vl(auVar97,auVar105,1);
      auVar96 = vxorps_avx512vl(auVar96,auVar91);
      auVar98 = vrcp14ps_avx512vl(auVar97);
      auVar91 = vxorps_avx512vl(auVar97,auVar91);
      auVar248 = ZEXT3264(auVar91);
      auVar99 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar117);
      auVar81 = vfmadd132ps_fma(auVar99,auVar98,auVar98);
      fVar216 = auVar81._0_4_ * auVar96._0_4_;
      fVar221 = auVar81._4_4_ * auVar96._4_4_;
      auVar50._4_4_ = fVar221;
      auVar50._0_4_ = fVar216;
      fVar222 = auVar81._8_4_ * auVar96._8_4_;
      auVar50._8_4_ = fVar222;
      fVar223 = auVar81._12_4_ * auVar96._12_4_;
      auVar50._12_4_ = fVar223;
      fVar224 = auVar96._16_4_ * 0.0;
      auVar50._16_4_ = fVar224;
      fVar237 = auVar96._20_4_ * 0.0;
      auVar50._20_4_ = fVar237;
      fVar243 = auVar96._24_4_ * 0.0;
      auVar50._24_4_ = fVar243;
      auVar50._28_4_ = auVar96._28_4_;
      uVar13 = vcmpps_avx512vl(auVar97,auVar91,1);
      bVar68 = (byte)uVar12 | (byte)uVar13;
      auVar99 = vblendmps_avx512vl(auVar50,auVar192);
      auVar121._0_4_ =
           (uint)(bVar68 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar98._0_4_;
      bVar75 = (bool)(bVar68 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar75 * auVar99._4_4_ | (uint)!bVar75 * auVar98._4_4_;
      bVar75 = (bool)(bVar68 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar75 * auVar99._8_4_ | (uint)!bVar75 * auVar98._8_4_;
      bVar75 = (bool)(bVar68 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar75 * auVar99._12_4_ | (uint)!bVar75 * auVar98._12_4_;
      bVar75 = (bool)(bVar68 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar75 * auVar99._16_4_ | (uint)!bVar75 * auVar98._16_4_;
      bVar75 = (bool)(bVar68 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar75 * auVar99._20_4_ | (uint)!bVar75 * auVar98._20_4_;
      bVar75 = (bool)(bVar68 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar75 * auVar99._24_4_ | (uint)!bVar75 * auVar98._24_4_;
      auVar121._28_4_ =
           (uint)(bVar68 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar98._28_4_;
      auVar247 = ZEXT3264(auVar121);
      _local_780 = vmaxps_avx(auVar115,auVar121);
      auVar242 = ZEXT3264(_local_780);
      uVar13 = vcmpps_avx512vl(auVar97,auVar91,6);
      bVar68 = (byte)uVar12 | (byte)uVar13;
      auVar122._0_4_ = (uint)(bVar68 & 1) * 0x7f800000 | (uint)!(bool)(bVar68 & 1) * (int)fVar216;
      bVar75 = (bool)(bVar68 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar221;
      bVar75 = (bool)(bVar68 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar222;
      bVar75 = (bool)(bVar68 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar223;
      bVar75 = (bool)(bVar68 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar224;
      bVar75 = (bool)(bVar68 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar237;
      bVar75 = (bool)(bVar68 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar243;
      auVar122._28_4_ =
           (uint)(bVar68 >> 7) * 0x7f800000 | (uint)!(bool)(bVar68 >> 7) * auVar96._28_4_;
      local_3a0 = vminps_avx(auVar89,auVar122);
      uVar12 = vcmpps_avx512vl(_local_780,local_3a0,2);
      bVar64 = bVar64 & 0x7f & (byte)uVar12;
      if (bVar64 == 0) {
        auVar264 = ZEXT3264(auVar117);
        goto LAB_01d121fe;
      }
      auVar91 = vmaxps_avx512vl(auVar103,auVar94);
      auVar94 = vfmadd213ps_avx512vl(auVar111,auVar108,auVar101);
      auVar94 = vmulps_avx512vl(auVar95,auVar94);
      auVar96 = vfmadd213ps_avx512vl(auVar107,auVar108,auVar101);
      auVar51._4_4_ = auVar95._4_4_ * auVar96._4_4_;
      auVar51._0_4_ = auVar95._0_4_ * auVar96._0_4_;
      auVar51._8_4_ = auVar95._8_4_ * auVar96._8_4_;
      auVar51._12_4_ = auVar95._12_4_ * auVar96._12_4_;
      auVar51._16_4_ = auVar95._16_4_ * auVar96._16_4_;
      auVar51._20_4_ = auVar95._20_4_ * auVar96._20_4_;
      auVar51._24_4_ = auVar95._24_4_ * auVar96._24_4_;
      auVar51._28_4_ = auVar121._28_4_;
      auVar94 = vminps_avx512vl(auVar94,auVar117);
      auVar58 = ZEXT812(0);
      auVar96 = ZEXT1232(auVar58) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar58) << 0x20);
      auVar97 = vminps_avx512vl(auVar51,auVar117);
      auVar52._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar94._28_4_ + 7.0;
      auVar81 = vfmadd213ps_fma(auVar52,local_8c0,local_8a0);
      local_1e0 = ZEXT1632(auVar81);
      auVar94 = vmaxps_avx(auVar97,ZEXT1232(auVar58) << 0x20);
      auVar53._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar94._28_4_ + 7.0;
      auVar81 = vfmadd213ps_fma(auVar53,local_8c0,local_8a0);
      local_200 = ZEXT1632(auVar81);
      auVar54._4_4_ = auVar91._4_4_ * auVar91._4_4_;
      auVar54._0_4_ = auVar91._0_4_ * auVar91._0_4_;
      auVar54._8_4_ = auVar91._8_4_ * auVar91._8_4_;
      auVar54._12_4_ = auVar91._12_4_ * auVar91._12_4_;
      auVar54._16_4_ = auVar91._16_4_ * auVar91._16_4_;
      auVar54._20_4_ = auVar91._20_4_ * auVar91._20_4_;
      auVar54._24_4_ = auVar91._24_4_ * auVar91._24_4_;
      auVar54._28_4_ = auVar91._28_4_;
      auVar94 = vsubps_avx(local_5e0,auVar54);
      auVar55._4_4_ = auVar94._4_4_ * (float)local_800._4_4_;
      auVar55._0_4_ = auVar94._0_4_ * (float)local_800._0_4_;
      auVar55._8_4_ = auVar94._8_4_ * fStack_7f8;
      auVar55._12_4_ = auVar94._12_4_ * fStack_7f4;
      auVar55._16_4_ = auVar94._16_4_ * fStack_7f0;
      auVar55._20_4_ = auVar94._20_4_ * fStack_7ec;
      auVar55._24_4_ = auVar94._24_4_ * fStack_7e8;
      auVar55._28_4_ = auVar91._28_4_;
      auVar91 = vsubps_avx(local_5c0,auVar55);
      uVar76 = vcmpps_avx512vl(auVar91,ZEXT1232(auVar58) << 0x20,5);
      auVar264 = ZEXT3264(auVar117);
      auVar260 = ZEXT3264(local_860);
      auVar263 = ZEXT3264(local_880);
      if ((byte)uVar76 == 0) {
        uVar76 = 0;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar236 = ZEXT864(0) << 0x20;
        auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar247 = ZEXT864(0) << 0x20;
        auVar123._8_4_ = 0x7f800000;
        auVar123._0_8_ = 0x7f8000007f800000;
        auVar123._12_4_ = 0x7f800000;
        auVar123._16_4_ = 0x7f800000;
        auVar123._20_4_ = 0x7f800000;
        auVar123._24_4_ = 0x7f800000;
        auVar123._28_4_ = 0x7f800000;
        auVar124._8_4_ = 0xff800000;
        auVar124._0_8_ = 0xff800000ff800000;
        auVar124._12_4_ = 0xff800000;
        auVar124._16_4_ = 0xff800000;
        auVar124._20_4_ = 0xff800000;
        auVar124._24_4_ = 0xff800000;
        auVar124._28_4_ = 0xff800000;
      }
      else {
        uVar77 = vcmpps_avx512vl(auVar91,auVar103,5);
        auVar91 = vsqrtps_avx(auVar91);
        auVar96 = vfnmadd213ps_avx512vl(auVar109,local_600,auVar117);
        auVar98 = vfmadd132ps_avx512vl(auVar96,local_600,local_600);
        auVar96 = vsubps_avx(local_740,auVar91);
        auVar99 = vmulps_avx512vl(auVar96,auVar98);
        auVar91 = vsubps_avx512vl(auVar91,auVar106);
        auVar98 = vmulps_avx512vl(auVar91,auVar98);
        auVar91 = vfmadd213ps_avx512vl(auVar108,auVar99,auVar101);
        auVar56._4_4_ = auVar95._4_4_ * auVar91._4_4_;
        auVar56._0_4_ = auVar95._0_4_ * auVar91._0_4_;
        auVar56._8_4_ = auVar95._8_4_ * auVar91._8_4_;
        auVar56._12_4_ = auVar95._12_4_ * auVar91._12_4_;
        auVar56._16_4_ = auVar95._16_4_ * auVar91._16_4_;
        auVar56._20_4_ = auVar95._20_4_ * auVar91._20_4_;
        auVar56._24_4_ = auVar95._24_4_ * auVar91._24_4_;
        auVar56._28_4_ = auVar97._28_4_;
        auVar91 = vmulps_avx512vl(local_460,auVar99);
        auVar96 = vmulps_avx512vl(local_480,auVar99);
        auVar100 = vmulps_avx512vl(local_4a0,auVar99);
        auVar97 = vfmadd213ps_avx512vl(auVar102,auVar56,local_5a0);
        auVar91 = vsubps_avx512vl(auVar91,auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar92,auVar56,local_680);
        auVar97 = vsubps_avx512vl(auVar96,auVar97);
        auVar81 = vfmadd213ps_fma(auVar56,auVar93,local_7e0);
        auVar96 = vsubps_avx(auVar100,ZEXT1632(auVar81));
        auVar247 = ZEXT3264(auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar108,auVar98,auVar101);
        auVar95 = vmulps_avx512vl(auVar95,auVar96);
        auVar96 = vmulps_avx512vl(local_460,auVar98);
        auVar100 = vmulps_avx512vl(local_480,auVar98);
        auVar90 = vmulps_avx512vl(local_4a0,auVar98);
        auVar81 = vfmadd213ps_fma(auVar102,auVar95,local_5a0);
        auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
        auVar81 = vfmadd213ps_fma(auVar92,auVar95,local_680);
        auVar92 = vsubps_avx512vl(auVar100,ZEXT1632(auVar81));
        auVar81 = vfmadd213ps_fma(auVar93,auVar95,local_7e0);
        auVar93 = vsubps_avx512vl(auVar90,ZEXT1632(auVar81));
        auVar236 = ZEXT3264(auVar93);
        auVar150._8_4_ = 0x7f800000;
        auVar150._0_8_ = 0x7f8000007f800000;
        auVar150._12_4_ = 0x7f800000;
        auVar150._16_4_ = 0x7f800000;
        auVar150._20_4_ = 0x7f800000;
        auVar150._24_4_ = 0x7f800000;
        auVar150._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar150,auVar99);
        bVar75 = (bool)((byte)uVar77 & 1);
        auVar123._0_4_ = (uint)bVar75 * auVar93._0_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar123._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar123._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar123._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * 0x7f800000;
        bVar75 = SUB81(uVar77 >> 7,0);
        auVar123._28_4_ = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * 0x7f800000;
        auVar193._8_4_ = 0xff800000;
        auVar193._0_8_ = 0xff800000ff800000;
        auVar193._12_4_ = 0xff800000;
        auVar193._16_4_ = 0xff800000;
        auVar193._20_4_ = 0xff800000;
        auVar193._24_4_ = 0xff800000;
        auVar193._28_4_ = 0xff800000;
        auVar93 = vblendmps_avx512vl(auVar193,auVar98);
        bVar75 = (bool)((byte)uVar77 & 1);
        auVar124._0_4_ = (uint)bVar75 * auVar93._0_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar124._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar124._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar124._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = SUB81(uVar77 >> 7,0);
        auVar124._28_4_ = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar93 = vmulps_avx512vl(auVar88,auVar31);
        uVar72 = vcmpps_avx512vl(auVar93,local_760,0xe);
        uVar77 = uVar77 & uVar72;
        bVar68 = (byte)uVar77;
        if (bVar68 != 0) {
          uVar72 = vcmpps_avx512vl(auVar94,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar235._8_4_ = 0x7f800000;
          auVar235._0_8_ = 0x7f8000007f800000;
          auVar235._12_4_ = 0x7f800000;
          auVar235._16_4_ = 0x7f800000;
          auVar235._20_4_ = 0x7f800000;
          auVar235._24_4_ = 0x7f800000;
          auVar235._28_4_ = 0x7f800000;
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar94 = vblendmps_avx512vl(auVar235,auVar241);
          bVar66 = (byte)uVar72;
          uVar71 = (uint)(bVar66 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar93._0_4_;
          bVar75 = (bool)((byte)(uVar72 >> 1) & 1);
          uVar67 = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * auVar93._4_4_;
          bVar75 = (bool)((byte)(uVar72 >> 2) & 1);
          uVar134 = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * auVar93._8_4_;
          bVar75 = (bool)((byte)(uVar72 >> 3) & 1);
          uVar135 = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * auVar93._12_4_;
          bVar75 = (bool)((byte)(uVar72 >> 4) & 1);
          uVar136 = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * auVar93._16_4_;
          bVar75 = (bool)((byte)(uVar72 >> 5) & 1);
          uVar137 = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * auVar93._20_4_;
          bVar75 = (bool)((byte)(uVar72 >> 6) & 1);
          uVar138 = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * auVar93._24_4_;
          bVar75 = SUB81(uVar72 >> 7,0);
          uVar139 = (uint)bVar75 * auVar94._28_4_ | (uint)!bVar75 * auVar93._28_4_;
          auVar123._0_4_ = (bVar68 & 1) * uVar71 | !(bool)(bVar68 & 1) * auVar123._0_4_;
          bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar123._4_4_ = bVar75 * uVar67 | !bVar75 * auVar123._4_4_;
          bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar123._8_4_ = bVar75 * uVar134 | !bVar75 * auVar123._8_4_;
          bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar123._12_4_ = bVar75 * uVar135 | !bVar75 * auVar123._12_4_;
          bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar123._16_4_ = bVar75 * uVar136 | !bVar75 * auVar123._16_4_;
          bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar123._20_4_ = bVar75 * uVar137 | !bVar75 * auVar123._20_4_;
          bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar123._24_4_ = bVar75 * uVar138 | !bVar75 * auVar123._24_4_;
          bVar75 = SUB81(uVar77 >> 7,0);
          auVar123._28_4_ = bVar75 * uVar139 | !bVar75 * auVar123._28_4_;
          auVar94 = vblendmps_avx512vl(auVar241,auVar235);
          bVar75 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar72 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar72 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar72 >> 6) & 1);
          bVar11 = SUB81(uVar72 >> 7,0);
          auVar124._0_4_ =
               (uint)(bVar68 & 1) *
               ((uint)(bVar66 & 1) * auVar94._0_4_ | !(bool)(bVar66 & 1) * uVar71) |
               !(bool)(bVar68 & 1) * auVar124._0_4_;
          bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar124._4_4_ =
               (uint)bVar5 * ((uint)bVar75 * auVar94._4_4_ | !bVar75 * uVar67) |
               !bVar5 * auVar124._4_4_;
          bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar124._8_4_ =
               (uint)bVar75 * ((uint)bVar6 * auVar94._8_4_ | !bVar6 * uVar134) |
               !bVar75 * auVar124._8_4_;
          bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar124._12_4_ =
               (uint)bVar75 * ((uint)bVar7 * auVar94._12_4_ | !bVar7 * uVar135) |
               !bVar75 * auVar124._12_4_;
          bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar124._16_4_ =
               (uint)bVar75 * ((uint)bVar8 * auVar94._16_4_ | !bVar8 * uVar136) |
               !bVar75 * auVar124._16_4_;
          bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar124._20_4_ =
               (uint)bVar75 * ((uint)bVar9 * auVar94._20_4_ | !bVar9 * uVar137) |
               !bVar75 * auVar124._20_4_;
          bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar124._24_4_ =
               (uint)bVar75 * ((uint)bVar10 * auVar94._24_4_ | !bVar10 * uVar138) |
               !bVar75 * auVar124._24_4_;
          bVar75 = SUB81(uVar77 >> 7,0);
          auVar124._28_4_ =
               (uint)bVar75 * ((uint)bVar11 * auVar94._28_4_ | !bVar11 * uVar139) |
               !bVar75 * auVar124._28_4_;
          uVar76 = (ulong)(byte)((~bVar68 | bVar66) & (byte)uVar76);
        }
      }
      auVar262 = ZEXT3264(local_900);
      auVar261 = ZEXT3264(local_8e0);
      auVar259 = ZEXT3264(local_980);
      auVar257 = ZEXT3264(local_960);
      auVar255 = ZEXT3264(local_940);
      auVar254 = ZEXT3264(local_920);
      auVar248._0_4_ = local_4a0._0_4_ * auVar236._0_4_;
      auVar248._4_4_ = local_4a0._4_4_ * auVar236._4_4_;
      auVar248._8_4_ = local_4a0._8_4_ * auVar236._8_4_;
      auVar248._12_4_ = local_4a0._12_4_ * auVar236._12_4_;
      auVar248._16_4_ = local_4a0._16_4_ * auVar236._16_4_;
      auVar248._20_4_ = local_4a0._20_4_ * auVar236._20_4_;
      auVar248._28_36_ = auVar236._28_36_;
      auVar248._24_4_ = local_4a0._24_4_ * auVar236._24_4_;
      auVar242 = ZEXT3264(local_480);
      auVar81 = vfmadd231ps_fma(auVar248._0_32_,local_480,auVar92);
      auVar236 = ZEXT3264(local_460);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_460,auVar96);
      auVar231._8_4_ = 0x7fffffff;
      auVar231._0_8_ = 0x7fffffff7fffffff;
      auVar231._12_4_ = 0x7fffffff;
      auVar231._16_4_ = 0x7fffffff;
      auVar231._20_4_ = 0x7fffffff;
      auVar231._24_4_ = 0x7fffffff;
      auVar231._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(ZEXT1632(auVar81),auVar231);
      auVar248 = ZEXT3264(_local_780);
      _local_1c0 = _local_780;
      auVar228._8_4_ = 0x3e99999a;
      auVar228._0_8_ = 0x3e99999a3e99999a;
      auVar228._12_4_ = 0x3e99999a;
      auVar228._16_4_ = 0x3e99999a;
      auVar228._20_4_ = 0x3e99999a;
      auVar228._24_4_ = 0x3e99999a;
      auVar228._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar94,auVar228,1);
      local_440._0_2_ = (short)uVar12;
      local_3c0 = vmaxps_avx(_local_780,auVar124);
      auVar94 = vminps_avx(local_3a0,auVar123);
      uVar12 = vcmpps_avx512vl(_local_780,auVar94,2);
      bVar68 = (byte)uVar12 & bVar64;
      uVar13 = vcmpps_avx512vl(local_3c0,local_3a0,2);
      auVar256 = ZEXT3264(local_820);
      auVar258 = ZEXT3264(local_840);
      if ((bVar64 & ((byte)uVar13 | (byte)uVar12)) != 0) {
        auVar57._4_4_ = local_4a0._4_4_ * auVar247._4_4_;
        auVar57._0_4_ = local_4a0._0_4_ * auVar247._0_4_;
        auVar57._8_4_ = local_4a0._8_4_ * auVar247._8_4_;
        auVar57._12_4_ = local_4a0._12_4_ * auVar247._12_4_;
        auVar57._16_4_ = local_4a0._16_4_ * auVar247._16_4_;
        auVar57._20_4_ = local_4a0._20_4_ * auVar247._20_4_;
        auVar57._24_4_ = local_4a0._24_4_ * auVar247._24_4_;
        auVar57._28_4_ = auVar94._28_4_;
        auVar81 = vfmadd213ps_fma(auVar97,local_480,auVar57);
        auVar81 = vfmadd213ps_fma(auVar91,local_460,ZEXT1632(auVar81));
        auVar94 = vandps_avx(ZEXT1632(auVar81),auVar231);
        uVar12 = vcmpps_avx512vl(auVar94,auVar228,1);
        local_9b0 = (undefined4)CONCAT71((int7)(uVar76 >> 8),~(byte)uVar76);
        bVar66 = (byte)uVar12 | ~(byte)uVar76;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar152,auVar32);
        local_360._0_4_ = (uint)(bVar66 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar75 = (bool)(bVar66 >> 1 & 1);
        local_360._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar66 >> 2 & 1);
        local_360._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar66 >> 3 & 1);
        local_360._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar66 >> 4 & 1);
        local_360._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar66 >> 5 & 1);
        local_360._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar66 >> 6 & 1);
        local_360._24_4_ = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * 2;
        local_360._28_4_ = (uint)(bVar66 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
        local_3e0 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_3e0,local_360,5);
        local_9ac = (uint)bVar68;
        bVar68 = (byte)uVar12 & bVar68;
        if (bVar68 == 0) {
          auVar154._4_4_ = uVar78;
          auVar154._0_4_ = uVar78;
          auVar154._8_4_ = uVar78;
          auVar154._12_4_ = uVar78;
          auVar154._16_4_ = uVar78;
          auVar154._20_4_ = uVar78;
          auVar154._24_4_ = uVar78;
          auVar154._28_4_ = uVar78;
          auVar94 = local_3c0;
        }
        else {
          local_380 = local_3c0;
          auVar82 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar81 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar79 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar83 = vminps_avx(auVar82,auVar79);
          auVar82 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar79 = vmaxps_avx(auVar81,auVar82);
          auVar173._8_4_ = 0x7fffffff;
          auVar173._0_8_ = 0x7fffffff7fffffff;
          auVar173._12_4_ = 0x7fffffff;
          auVar81 = vandps_avx(auVar83,auVar173);
          auVar82 = vandps_avx(auVar79,auVar173);
          auVar81 = vmaxps_avx(auVar81,auVar82);
          auVar82 = vmovshdup_avx(auVar81);
          auVar82 = vmaxss_avx(auVar82,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar82);
          fVar216 = auVar81._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar79,auVar79,0xff);
          local_420 = (float)local_780._0_4_ + (float)local_9a0._0_4_;
          fStack_41c = (float)local_780._4_4_ + (float)local_9a0._4_4_;
          fStack_418 = fStack_778 + fStack_998;
          fStack_414 = fStack_774 + fStack_994;
          fStack_410 = fStack_770 + fStack_990;
          fStack_40c = fStack_76c + fStack_98c;
          fStack_408 = fStack_768 + fStack_988;
          fStack_404 = fStack_764 + fStack_984;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar153,_local_780);
            auVar126._0_4_ =
                 (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar68 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar94 = vminps_avx(auVar126,auVar94);
            auVar91 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar91);
            auVar91 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar91);
            uVar12 = vcmpps_avx512vl(auVar126,auVar94,0);
            bVar65 = (byte)uVar12 & bVar68;
            bVar66 = bVar68;
            if (bVar65 != 0) {
              bVar66 = bVar65;
            }
            iVar15 = 0;
            for (uVar78 = (uint)bVar66; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            fVar221 = local_9a8;
            auVar81 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            auVar82 = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar15 << 2)));
            if ((float)local_720._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar15 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
              fVar221 = sqrtf((float)local_720._0_4_);
              auVar81 = local_8c0._0_16_;
              auVar82 = local_8a0._0_16_;
            }
            auVar81 = vinsertps_avx(auVar81,auVar82,0x10);
            bVar75 = true;
            uVar76 = 0;
            do {
              uVar156 = auVar81._0_4_;
              auVar142._4_4_ = uVar156;
              auVar142._0_4_ = uVar156;
              auVar142._8_4_ = uVar156;
              auVar142._12_4_ = uVar156;
              auVar82 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_710);
              auVar79 = vmovshdup_avx(auVar81);
              fVar215 = auVar79._0_4_;
              fVar214 = 1.0 - fVar215;
              fVar141 = fVar215 * fVar215;
              auVar238 = SUB6416(ZEXT464(0x40400000),0);
              auVar85 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar84 = vfmadd213ss_fma(auVar238,auVar79,auVar85);
              auVar83 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar141),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar80 = vfmadd213ss_fma(auVar238,ZEXT416((uint)fVar214),auVar85);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)(fVar214 * fVar214)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar198 = fVar214 * fVar214 * -fVar215 * 0.5;
              fVar211 = auVar83._0_4_ * 0.5;
              fVar212 = auVar80._0_4_ * 0.5;
              fVar213 = fVar215 * fVar215 * -fVar214 * 0.5;
              auVar199._0_4_ = fVar213 * (float)local_700._0_4_;
              auVar199._4_4_ = fVar213 * (float)local_700._4_4_;
              auVar199._8_4_ = fVar213 * fStack_6f8;
              auVar199._12_4_ = fVar213 * fStack_6f4;
              auVar217._4_4_ = fVar212;
              auVar217._0_4_ = fVar212;
              auVar217._8_4_ = fVar212;
              auVar217._12_4_ = fVar212;
              auVar83 = vfmadd132ps_fma(auVar217,auVar199,local_6c0._0_16_);
              auVar174._4_4_ = fVar211;
              auVar174._0_4_ = fVar211;
              auVar174._8_4_ = fVar211;
              auVar174._12_4_ = fVar211;
              auVar83 = vfmadd132ps_fma(auVar174,auVar83,local_6e0._0_16_);
              auVar200._4_4_ = fVar198;
              auVar200._0_4_ = fVar198;
              auVar200._8_4_ = fVar198;
              auVar200._12_4_ = fVar198;
              auVar83 = vfmadd132ps_fma(auVar200,auVar83,local_6a0._0_16_);
              auVar80 = vfmadd231ss_fma(auVar85,auVar79,ZEXT416(0x41100000));
              local_5c0._0_16_ = auVar80;
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar79,ZEXT416(0x40800000));
              local_5e0._0_16_ = auVar80;
              auVar80 = vfmadd213ss_fma(auVar238,auVar79,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar80;
              local_5a0._0_16_ = auVar83;
              auVar82 = vsubps_avx(auVar82,auVar83);
              local_8a0._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_8c0._0_16_ = auVar82;
              local_680._0_16_ = auVar81;
              if (auVar82._0_4_ < 0.0) {
                local_7e0._0_4_ = auVar84._0_4_;
                _local_800 = ZEXT416((uint)fVar214);
                local_740._0_4_ = fVar141;
                local_760._0_4_ = fVar214 * -2.0;
                auVar264._0_4_ = sqrtf(auVar82._0_4_);
                auVar264._4_60_ = extraout_var;
                auVar84 = ZEXT416((uint)local_7e0._0_4_);
                auVar81 = auVar264._0_16_;
                auVar82 = _local_800;
              }
              else {
                auVar81 = vsqrtss_avx(auVar82,auVar82);
                local_760._0_4_ = fVar214 * -2.0;
                local_740._0_4_ = fVar141;
                auVar82 = ZEXT416((uint)fVar214);
              }
              fVar141 = auVar82._0_4_;
              auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(fVar215 * (fVar141 + fVar141))),auVar82,
                                         auVar82);
              auVar82 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar215 + fVar215)),
                                        ZEXT416((uint)(fVar215 * fVar215 * 3.0)));
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * -3.0)),
                                        ZEXT416((uint)(fVar141 + fVar141)),auVar83);
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)local_760._0_4_),auVar79,
                                        ZEXT416((uint)local_740._0_4_));
              fVar141 = auVar80._0_4_ * 0.5;
              fVar198 = auVar82._0_4_ * 0.5;
              fVar211 = auVar84._0_4_ * 0.5;
              fVar212 = auVar83._0_4_ * 0.5;
              auVar201._0_4_ = fVar212 * (float)local_700._0_4_;
              auVar201._4_4_ = fVar212 * (float)local_700._4_4_;
              auVar201._8_4_ = fVar212 * fStack_6f8;
              auVar201._12_4_ = fVar212 * fStack_6f4;
              auVar175._4_4_ = fVar211;
              auVar175._0_4_ = fVar211;
              auVar175._8_4_ = fVar211;
              auVar175._12_4_ = fVar211;
              auVar82 = vfmadd132ps_fma(auVar175,auVar201,local_6c0._0_16_);
              auVar158._4_4_ = fVar198;
              auVar158._0_4_ = fVar198;
              auVar158._8_4_ = fVar198;
              auVar158._12_4_ = fVar198;
              auVar82 = vfmadd132ps_fma(auVar158,auVar82,local_6e0._0_16_);
              auVar250._4_4_ = fVar141;
              auVar250._0_4_ = fVar141;
              auVar250._8_4_ = fVar141;
              auVar250._12_4_ = fVar141;
              local_7e0._0_16_ = vfmadd132ps_fma(auVar250,auVar82,local_6a0._0_16_);
              local_740._0_16_ = vdpps_avx(local_7e0._0_16_,local_7e0._0_16_,0x7f);
              auVar59._12_4_ = 0;
              auVar59._0_12_ = ZEXT812(0);
              fVar141 = local_740._0_4_;
              auVar82 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar141));
              fVar198 = auVar82._0_4_;
              local_760._0_16_ = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar141));
              auVar16._8_4_ = 0x80000000;
              auVar16._0_8_ = 0x8000000080000000;
              auVar16._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(local_740._0_16_,auVar16);
              auVar82 = vfnmadd213ss_fma(local_760._0_16_,local_740._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_7c0._0_4_ = auVar82._0_4_;
              local_800._0_4_ = auVar81._0_4_;
              if (fVar141 < auVar83._0_4_) {
                fVar211 = sqrtf(fVar141);
                auVar81 = ZEXT416((uint)local_800._0_4_);
                auVar82 = local_7e0._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(local_740._0_16_,local_740._0_16_);
                fVar211 = auVar82._0_4_;
                auVar82 = local_7e0._0_16_;
              }
              fVar141 = fVar198 * 1.5 + fVar141 * -0.5 * fVar198 * fVar198 * fVar198;
              auVar143._0_4_ = auVar82._0_4_ * fVar141;
              auVar143._4_4_ = auVar82._4_4_ * fVar141;
              auVar143._8_4_ = auVar82._8_4_ * fVar141;
              auVar143._12_4_ = auVar82._12_4_ * fVar141;
              auVar83 = vdpps_avx(local_8a0._0_16_,auVar143,0x7f);
              fVar213 = auVar81._0_4_;
              fVar198 = auVar83._0_4_;
              auVar144._0_4_ = fVar198 * fVar198;
              auVar144._4_4_ = auVar83._4_4_ * auVar83._4_4_;
              auVar144._8_4_ = auVar83._8_4_ * auVar83._8_4_;
              auVar144._12_4_ = auVar83._12_4_ * auVar83._12_4_;
              auVar84 = vsubps_avx512vl(local_8c0._0_16_,auVar144);
              fVar212 = auVar84._0_4_;
              auVar159._4_12_ = ZEXT812(0) << 0x20;
              auVar159._0_4_ = fVar212;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
              auVar85 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              if (fVar212 < 0.0) {
                local_630 = fVar141;
                fStack_62c = fVar141;
                fStack_628 = fVar141;
                fStack_624 = fVar141;
                local_620 = auVar80;
                fVar222 = sqrtf(fVar212);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar81 = ZEXT416((uint)local_800._0_4_);
                auVar84 = local_620;
                auVar82 = local_7e0._0_16_;
                fVar141 = local_630;
                fVar212 = fStack_62c;
                fVar214 = fStack_628;
                fVar215 = fStack_624;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar222 = auVar84._0_4_;
                auVar84 = auVar80;
                fVar212 = fVar141;
                fVar214 = fVar141;
                fVar215 = fVar141;
              }
              auVar247 = ZEXT1664(local_8a0._0_16_);
              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar264 = ZEXT3264(auVar94);
              auVar254 = ZEXT3264(local_920);
              auVar255 = ZEXT3264(local_940);
              auVar256 = ZEXT3264(local_820);
              auVar257 = ZEXT3264(local_960);
              auVar258 = ZEXT3264(local_840);
              auVar259 = ZEXT3264(local_980);
              auVar260 = ZEXT3264(local_860);
              auVar261 = ZEXT3264(local_8e0);
              auVar262 = ZEXT3264(local_900);
              auVar263 = ZEXT3264(local_880);
              auVar160._0_4_ = (float)local_600._0_4_ * (float)local_700._0_4_;
              auVar160._4_4_ = (float)local_600._0_4_ * (float)local_700._4_4_;
              auVar160._8_4_ = (float)local_600._0_4_ * fStack_6f8;
              auVar160._12_4_ = (float)local_600._0_4_ * fStack_6f4;
              auVar176._4_4_ = local_5e0._0_4_;
              auVar176._0_4_ = local_5e0._0_4_;
              auVar176._8_4_ = local_5e0._0_4_;
              auVar176._12_4_ = local_5e0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar176,auVar160,local_6c0._0_16_);
              auVar161._4_4_ = local_5c0._0_4_;
              auVar161._0_4_ = local_5c0._0_4_;
              auVar161._8_4_ = local_5c0._0_4_;
              auVar161._12_4_ = local_5c0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar161,auVar238,local_6e0._0_16_);
              auVar79 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar156 = auVar79._0_4_;
              auVar177._4_4_ = uVar156;
              auVar177._0_4_ = uVar156;
              auVar177._8_4_ = uVar156;
              auVar177._12_4_ = uVar156;
              auVar79 = vfmadd132ps_fma(auVar177,auVar238,local_6a0._0_16_);
              auVar162._0_4_ = auVar79._0_4_ * (float)local_740._0_4_;
              auVar162._4_4_ = auVar79._4_4_ * (float)local_740._0_4_;
              auVar162._8_4_ = auVar79._8_4_ * (float)local_740._0_4_;
              auVar162._12_4_ = auVar79._12_4_ * (float)local_740._0_4_;
              auVar79 = vdpps_avx(auVar82,auVar79,0x7f);
              fVar197 = auVar79._0_4_;
              auVar178._0_4_ = auVar82._0_4_ * fVar197;
              auVar178._4_4_ = auVar82._4_4_ * fVar197;
              auVar178._8_4_ = auVar82._8_4_ * fVar197;
              auVar178._12_4_ = auVar82._12_4_ * fVar197;
              auVar79 = vsubps_avx(auVar162,auVar178);
              fVar197 = (float)local_7c0._0_4_ * (float)local_760._0_4_;
              auVar238 = vmaxss_avx(ZEXT416((uint)fVar216),
                                    ZEXT416((uint)(local_680._0_4_ * fVar221 * 1.9073486e-06)));
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar128._16_16_ = local_880._16_16_;
              auVar86 = vxorps_avx512vl(auVar82,auVar17);
              auVar179._0_4_ = fVar141 * auVar79._0_4_ * fVar197;
              auVar179._4_4_ = fVar212 * auVar79._4_4_ * fVar197;
              auVar179._8_4_ = fVar214 * auVar79._8_4_ * fVar197;
              auVar179._12_4_ = fVar215 * auVar79._12_4_ * fVar197;
              auVar248 = ZEXT1664(auVar143);
              auVar79 = vdpps_avx(auVar86,auVar143,0x7f);
              auVar1 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar216),auVar238);
              auVar81 = vdpps_avx(local_8a0._0_16_,auVar179,0x7f);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                       ZEXT416((uint)(fVar216 / fVar211)),auVar1);
              fVar141 = auVar79._0_4_ + auVar81._0_4_;
              auVar81 = vdpps_avx(local_710,auVar143,0x7f);
              auVar79 = vdpps_avx(local_8a0._0_16_,auVar86,0x7f);
              auVar85 = vmulss_avx512f(auVar85,auVar84);
              fVar211 = auVar80._0_4_ * 1.5 + auVar85._0_4_ * auVar84._0_4_ * auVar84._0_4_;
              auVar84 = vdpps_avx(local_8a0._0_16_,local_710,0x7f);
              auVar85 = vfnmadd231ss_fma(auVar79,auVar83,ZEXT416((uint)fVar141));
              auVar84 = vfnmadd231ss_fma(auVar84,auVar83,auVar81);
              auVar79 = vpermilps_avx(local_5a0._0_16_,0xff);
              fVar222 = fVar222 - auVar79._0_4_;
              auVar80 = vshufps_avx(auVar82,auVar82,0xff);
              auVar79 = vfmsub213ss_fma(auVar85,ZEXT416((uint)fVar211),auVar80);
              auVar239._8_4_ = 0x80000000;
              auVar239._0_8_ = 0x8000000080000000;
              auVar239._12_4_ = 0x80000000;
              auVar242 = ZEXT1664(auVar239);
              auVar233._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar233);
              auVar84 = ZEXT416((uint)(auVar84._0_4_ * fVar211));
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar141),auVar84);
              auVar79 = vinsertps_avx(auVar233,auVar84,0x1c);
              auVar226._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar81._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar84 = vinsertps_avx(ZEXT416((uint)fVar141),auVar226,0x10);
              auVar202._0_4_ = auVar85._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar81 = vdivps_avx(auVar79,auVar202);
              auVar79 = vdivps_avx(auVar84,auVar202);
              auVar203._0_4_ = fVar198 * auVar81._0_4_ + fVar222 * auVar79._0_4_;
              auVar203._4_4_ = fVar198 * auVar81._4_4_ + fVar222 * auVar79._4_4_;
              auVar203._8_4_ = fVar198 * auVar81._8_4_ + fVar222 * auVar79._8_4_;
              auVar203._12_4_ = fVar198 * auVar81._12_4_ + fVar222 * auVar79._12_4_;
              auVar81 = vsubps_avx(local_680._0_16_,auVar203);
              auVar18._8_4_ = 0x7fffffff;
              auVar18._0_8_ = 0x7fffffff7fffffff;
              auVar18._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(auVar83,auVar18);
              fVar141 = (float)local_9a0._0_4_;
              fVar198 = (float)local_9a0._4_4_;
              fVar211 = fStack_998;
              fVar212 = fStack_994;
              fVar213 = fStack_990;
              fVar214 = fStack_98c;
              fVar215 = fStack_988;
              fVar197 = fStack_984;
              if (auVar79._0_4_ < auVar1._0_4_) {
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar238._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar19._8_4_ = 0x7fffffff;
                auVar19._0_8_ = 0x7fffffff7fffffff;
                auVar19._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(ZEXT416((uint)fVar222),auVar19);
                if (auVar83._0_4_ < auVar79._0_4_) {
                  fVar221 = auVar81._0_4_ + (float)local_650._0_4_;
                  if (fVar221 < fVar140) {
LAB_01d12d2b:
                    bVar66 = 0;
                    goto LAB_01d12d53;
                  }
                  fVar222 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar221 <= fVar222) {
                    auVar79 = vmovshdup_avx(auVar81);
                    bVar66 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_01d12d53;
                    auVar204._0_12_ = ZEXT812(0);
                    auVar204._12_4_ = 0;
                    auVar128._0_16_ = auVar204;
                    auVar127._4_28_ = auVar128._4_28_;
                    auVar127._0_4_ = local_8c0._0_4_;
                    auVar79 = vrsqrt14ss_avx512f(auVar204,auVar127._0_16_);
                    fVar223 = auVar79._0_4_;
                    auVar79 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar74].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01d12d2b;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar66 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01d12d53;
                    fVar223 = fVar223 * 1.5 + auVar79._0_4_ * fVar223 * fVar223 * fVar223;
                    auVar180._0_4_ = local_8a0._0_4_ * fVar223;
                    auVar180._4_4_ = local_8a0._4_4_ * fVar223;
                    auVar180._8_4_ = local_8a0._8_4_ * fVar223;
                    auVar180._12_4_ = local_8a0._12_4_ * fVar223;
                    auVar84 = vfmadd213ps_fma(auVar80,auVar180,auVar82);
                    auVar79 = vshufps_avx(auVar180,auVar180,0xc9);
                    auVar83 = vshufps_avx(auVar82,auVar82,0xc9);
                    auVar181._0_4_ = auVar180._0_4_ * auVar83._0_4_;
                    auVar181._4_4_ = auVar180._4_4_ * auVar83._4_4_;
                    auVar181._8_4_ = auVar180._8_4_ * auVar83._8_4_;
                    auVar181._12_4_ = auVar180._12_4_ * auVar83._12_4_;
                    auVar83 = vfmsub231ps_fma(auVar181,auVar82,auVar79);
                    auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar79 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                    auVar145._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                    auVar145._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                    auVar145._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                    auVar145._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                    auVar82 = vfmsub231ps_fma(auVar145,auVar82,auVar79);
                    local_510 = vshufps_avx(auVar81,auVar81,0x55);
                    local_540 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                    auStack_530 = vshufps_avx(auVar82,auVar82,0xaa);
                    local_520 = auVar82._0_4_;
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    local_500 = ZEXT416(0) << 0x20;
                    local_4f0 = local_550._0_8_;
                    uStack_4e8 = local_550._8_8_;
                    local_4e0 = local_560;
                    vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                    uStack_4cc = context->user->instID[0];
                    local_4d0 = uStack_4cc;
                    uStack_4c8 = uStack_4cc;
                    uStack_4c4 = uStack_4cc;
                    uStack_4c0 = context->user->instPrimID[0];
                    uStack_4bc = uStack_4c0;
                    uStack_4b8 = uStack_4c0;
                    uStack_4b4 = uStack_4c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar221;
                    local_9c0 = local_570;
                    local_7b0.valid = (int *)local_9c0;
                    local_7b0.geometryUserPtr = pGVar3->userPtr;
                    local_7b0.context = context->user;
                    local_7b0.hit = local_540;
                    local_7b0.N = 4;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar236 = ZEXT1664(auVar233);
                      auVar242 = ZEXT1664(auVar239);
                      auVar247 = ZEXT1664(local_8a0._0_16_);
                      auVar248 = ZEXT1664(auVar143);
                      (*pGVar3->occlusionFilterN)(&local_7b0);
                      auVar263 = ZEXT3264(local_880);
                      auVar262 = ZEXT3264(local_900);
                      auVar261 = ZEXT3264(local_8e0);
                      auVar260 = ZEXT3264(local_860);
                      auVar259 = ZEXT3264(local_980);
                      auVar258 = ZEXT3264(local_840);
                      auVar257 = ZEXT3264(local_960);
                      auVar256 = ZEXT3264(local_820);
                      auVar255 = ZEXT3264(local_940);
                      auVar254 = ZEXT3264(local_920);
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar264 = ZEXT3264(auVar94);
                      fVar141 = (float)local_9a0._0_4_;
                      fVar198 = (float)local_9a0._4_4_;
                      fVar211 = fStack_998;
                      fVar212 = fStack_994;
                      fVar213 = fStack_990;
                      fVar214 = fStack_98c;
                      fVar215 = fStack_988;
                      fVar197 = fStack_984;
                    }
                    uVar76 = vptestmd_avx512vl(local_9c0,local_9c0);
                    if ((uVar76 & 0xf) != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar236 = ZEXT1664(auVar236._0_16_);
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        (*p_Var4)(&local_7b0);
                        auVar263 = ZEXT3264(local_880);
                        auVar262 = ZEXT3264(local_900);
                        auVar261 = ZEXT3264(local_8e0);
                        auVar260 = ZEXT3264(local_860);
                        auVar259 = ZEXT3264(local_980);
                        auVar258 = ZEXT3264(local_840);
                        auVar257 = ZEXT3264(local_960);
                        auVar256 = ZEXT3264(local_820);
                        auVar255 = ZEXT3264(local_940);
                        auVar254 = ZEXT3264(local_920);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar264 = ZEXT3264(auVar94);
                        fVar141 = (float)local_9a0._0_4_;
                        fVar198 = (float)local_9a0._4_4_;
                        fVar211 = fStack_998;
                        fVar212 = fStack_994;
                        fVar213 = fStack_990;
                        fVar214 = fStack_98c;
                        fVar215 = fStack_988;
                        fVar197 = fStack_984;
                      }
                      uVar76 = vptestmd_avx512vl(local_9c0,local_9c0);
                      uVar76 = uVar76 & 0xf;
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar5 = (bool)((byte)uVar76 & 1);
                      bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
                      bVar8 = SUB81(uVar76 >> 3,0);
                      *(uint *)(local_7b0.ray + 0x80) =
                           (uint)bVar5 * auVar81._0_4_ |
                           (uint)!bVar5 * *(int *)(local_7b0.ray + 0x80);
                      *(uint *)(local_7b0.ray + 0x84) =
                           (uint)bVar6 * auVar81._4_4_ |
                           (uint)!bVar6 * *(int *)(local_7b0.ray + 0x84);
                      *(uint *)(local_7b0.ray + 0x88) =
                           (uint)bVar7 * auVar81._8_4_ |
                           (uint)!bVar7 * *(int *)(local_7b0.ray + 0x88);
                      *(uint *)(local_7b0.ray + 0x8c) =
                           (uint)bVar8 * auVar81._12_4_ |
                           (uint)!bVar8 * *(int *)(local_7b0.ray + 0x8c);
                      bVar66 = 1;
                      if ((byte)uVar76 != 0) goto LAB_01d12d53;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar222;
                  }
                  bVar66 = 0;
                  goto LAB_01d12d53;
                }
              }
              bVar75 = uVar76 < 4;
              uVar76 = uVar76 + 1;
            } while (uVar76 != 5);
            bVar75 = false;
            bVar66 = 5;
LAB_01d12d53:
            bVar73 = (bool)(bVar73 | bVar75 & bVar66);
            uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar154._4_4_ = uVar156;
            auVar154._0_4_ = uVar156;
            auVar154._8_4_ = uVar156;
            auVar154._12_4_ = uVar156;
            auVar154._16_4_ = uVar156;
            auVar154._20_4_ = uVar156;
            auVar154._24_4_ = uVar156;
            auVar154._28_4_ = uVar156;
            auVar61._4_4_ = fStack_41c;
            auVar61._0_4_ = local_420;
            auVar61._8_4_ = fStack_418;
            auVar61._12_4_ = fStack_414;
            auVar61._16_4_ = fStack_410;
            auVar61._20_4_ = fStack_40c;
            auVar61._24_4_ = fStack_408;
            auVar61._28_4_ = fStack_404;
            uVar12 = vcmpps_avx512vl(auVar154,auVar61,0xd);
            bVar68 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar68 & (byte)uVar12;
            auVar94 = local_380;
          } while (bVar68 != 0);
        }
        auVar232 = ZEXT3264(local_3c0);
        bVar68 = local_440[0] | (byte)local_9b0;
        auVar171._0_4_ = fVar141 + auVar94._0_4_;
        auVar171._4_4_ = fVar198 + auVar94._4_4_;
        auVar171._8_4_ = fVar211 + auVar94._8_4_;
        auVar171._12_4_ = fVar212 + auVar94._12_4_;
        auVar171._16_4_ = fVar213 + auVar94._16_4_;
        auVar171._20_4_ = fVar214 + auVar94._20_4_;
        auVar171._24_4_ = fVar215 + auVar94._24_4_;
        auVar171._28_4_ = fVar197 + auVar94._28_4_;
        uVar12 = vcmpps_avx512vl(auVar171,auVar154,2);
        bVar64 = (byte)uVar13 & bVar64 & (byte)uVar12;
        auVar172._8_4_ = 2;
        auVar172._0_8_ = 0x200000002;
        auVar172._12_4_ = 2;
        auVar172._16_4_ = 2;
        auVar172._20_4_ = 2;
        auVar172._24_4_ = 2;
        auVar172._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar172,auVar33);
        auVar129._0_4_ = (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar75 = (bool)(bVar68 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar68 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar68 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar68 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar68 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar68 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * 2;
        auVar129._28_4_ = (uint)(bVar68 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        uVar12 = vpcmpd_avx512vl(local_3e0,auVar129,5);
        bVar68 = (byte)uVar12 & bVar64;
        if (bVar68 != 0) {
          local_440 = auVar129;
          auVar82 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar81 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar79 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar83 = vminps_avx(auVar82,auVar79);
          auVar82 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar79 = vmaxps_avx(auVar81,auVar82);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar81 = vandps_avx(auVar83,auVar182);
          auVar82 = vandps_avx(auVar79,auVar182);
          auVar81 = vmaxps_avx(auVar81,auVar82);
          auVar82 = vmovshdup_avx(auVar81);
          auVar82 = vmaxss_avx(auVar82,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar82);
          fVar216 = auVar81._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar79,auVar79,0xff);
          local_420 = fVar141 + local_3c0._0_4_;
          fStack_41c = fVar198 + local_3c0._4_4_;
          fStack_418 = fVar211 + local_3c0._8_4_;
          fStack_414 = fVar212 + local_3c0._12_4_;
          fStack_410 = fVar213 + local_3c0._16_4_;
          fStack_40c = fVar214 + local_3c0._20_4_;
          fStack_408 = fVar215 + local_3c0._24_4_;
          fStack_404 = fVar197 + local_3c0._28_4_;
          _local_780 = local_3c0;
          do {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar155,auVar232._0_32_);
            auVar130._0_4_ =
                 (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar68 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 0x7f800000;
            auVar130._24_4_ =
                 (uint)(bVar68 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
            auVar130._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar94 = vminps_avx(auVar130,auVar94);
            auVar91 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar91);
            auVar91 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar91);
            uVar12 = vcmpps_avx512vl(auVar130,auVar94,0);
            bVar65 = (byte)uVar12 & bVar68;
            bVar66 = bVar68;
            if (bVar65 != 0) {
              bVar66 = bVar65;
            }
            iVar15 = 0;
            for (uVar78 = (uint)bVar66; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            fVar221 = local_9a4;
            auVar81 = ZEXT416(*(uint *)(local_3a0 + (uint)(iVar15 << 2)));
            auVar82 = ZEXT416(*(uint *)(local_200 + (uint)(iVar15 << 2)));
            if ((float)local_720._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar15 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_3a0 + (uint)(iVar15 << 2)));
              fVar221 = sqrtf((float)local_720._0_4_);
              auVar81 = local_8c0._0_16_;
              auVar82 = local_8a0._0_16_;
            }
            auVar81 = vinsertps_avx(auVar81,auVar82,0x10);
            bVar75 = true;
            uVar76 = 0;
            do {
              uVar156 = auVar81._0_4_;
              auVar146._4_4_ = uVar156;
              auVar146._0_4_ = uVar156;
              auVar146._8_4_ = uVar156;
              auVar146._12_4_ = uVar156;
              auVar82 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_710);
              auVar79 = vmovshdup_avx(auVar81);
              fVar215 = auVar79._0_4_;
              fVar214 = 1.0 - fVar215;
              fVar141 = fVar215 * fVar215;
              auVar238 = SUB6416(ZEXT464(0x40400000),0);
              auVar85 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar84 = vfmadd213ss_fma(auVar238,auVar79,auVar85);
              auVar83 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar141),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar80 = vfmadd213ss_fma(auVar238,ZEXT416((uint)fVar214),auVar85);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)(fVar214 * fVar214)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar198 = fVar214 * fVar214 * -fVar215 * 0.5;
              fVar211 = auVar83._0_4_ * 0.5;
              fVar212 = auVar80._0_4_ * 0.5;
              fVar213 = fVar215 * fVar215 * -fVar214 * 0.5;
              auVar205._0_4_ = fVar213 * (float)local_700._0_4_;
              auVar205._4_4_ = fVar213 * (float)local_700._4_4_;
              auVar205._8_4_ = fVar213 * fStack_6f8;
              auVar205._12_4_ = fVar213 * fStack_6f4;
              auVar218._4_4_ = fVar212;
              auVar218._0_4_ = fVar212;
              auVar218._8_4_ = fVar212;
              auVar218._12_4_ = fVar212;
              auVar83 = vfmadd132ps_fma(auVar218,auVar205,local_6c0._0_16_);
              auVar183._4_4_ = fVar211;
              auVar183._0_4_ = fVar211;
              auVar183._8_4_ = fVar211;
              auVar183._12_4_ = fVar211;
              auVar83 = vfmadd132ps_fma(auVar183,auVar83,local_6e0._0_16_);
              auVar206._4_4_ = fVar198;
              auVar206._0_4_ = fVar198;
              auVar206._8_4_ = fVar198;
              auVar206._12_4_ = fVar198;
              auVar83 = vfmadd132ps_fma(auVar206,auVar83,local_6a0._0_16_);
              auVar80 = vfmadd231ss_fma(auVar85,auVar79,ZEXT416(0x41100000));
              local_5c0._0_16_ = auVar80;
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar79,ZEXT416(0x40800000));
              local_5e0._0_16_ = auVar80;
              auVar80 = vfmadd213ss_fma(auVar238,auVar79,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar80;
              local_5a0._0_16_ = auVar83;
              auVar82 = vsubps_avx(auVar82,auVar83);
              local_8a0._0_16_ = auVar82;
              auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
              local_8c0._0_16_ = auVar82;
              local_680._0_16_ = auVar81;
              if (auVar82._0_4_ < 0.0) {
                local_7e0._0_4_ = auVar84._0_4_;
                _local_800 = ZEXT416((uint)fVar214);
                local_740._0_4_ = fVar141;
                local_760._0_4_ = fVar214 * -2.0;
                auVar247._0_4_ = sqrtf(auVar82._0_4_);
                auVar247._4_60_ = extraout_var_00;
                auVar84 = ZEXT416((uint)local_7e0._0_4_);
                auVar81 = auVar247._0_16_;
                auVar82 = _local_800;
              }
              else {
                auVar81 = vsqrtss_avx(auVar82,auVar82);
                local_760._0_4_ = fVar214 * -2.0;
                local_740._0_4_ = fVar141;
                auVar82 = ZEXT416((uint)fVar214);
              }
              fVar141 = auVar82._0_4_;
              auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(fVar215 * (fVar141 + fVar141))),auVar82,
                                         auVar82);
              auVar82 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar215 + fVar215)),
                                        ZEXT416((uint)(fVar215 * fVar215 * 3.0)));
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * -3.0)),
                                        ZEXT416((uint)(fVar141 + fVar141)),auVar83);
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)local_760._0_4_),auVar79,
                                        ZEXT416((uint)local_740._0_4_));
              fVar141 = auVar80._0_4_ * 0.5;
              fVar198 = auVar82._0_4_ * 0.5;
              fVar211 = auVar84._0_4_ * 0.5;
              fVar212 = auVar83._0_4_ * 0.5;
              auVar207._0_4_ = fVar212 * (float)local_700._0_4_;
              auVar207._4_4_ = fVar212 * (float)local_700._4_4_;
              auVar207._8_4_ = fVar212 * fStack_6f8;
              auVar207._12_4_ = fVar212 * fStack_6f4;
              auVar184._4_4_ = fVar211;
              auVar184._0_4_ = fVar211;
              auVar184._8_4_ = fVar211;
              auVar184._12_4_ = fVar211;
              auVar82 = vfmadd132ps_fma(auVar184,auVar207,local_6c0._0_16_);
              auVar163._4_4_ = fVar198;
              auVar163._0_4_ = fVar198;
              auVar163._8_4_ = fVar198;
              auVar163._12_4_ = fVar198;
              auVar82 = vfmadd132ps_fma(auVar163,auVar82,local_6e0._0_16_);
              auVar251._4_4_ = fVar141;
              auVar251._0_4_ = fVar141;
              auVar251._8_4_ = fVar141;
              auVar251._12_4_ = fVar141;
              local_7e0._0_16_ = vfmadd132ps_fma(auVar251,auVar82,local_6a0._0_16_);
              local_740._0_16_ = vdpps_avx(local_7e0._0_16_,local_7e0._0_16_,0x7f);
              auVar60._12_4_ = 0;
              auVar60._0_12_ = ZEXT812(0);
              fVar141 = local_740._0_4_;
              auVar82 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar141));
              fVar198 = auVar82._0_4_;
              local_760._0_16_ = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar141));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(local_740._0_16_,auVar20);
              auVar82 = vfnmadd213ss_fma(local_760._0_16_,local_740._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_7c0._0_4_ = auVar82._0_4_;
              local_800._0_4_ = auVar81._0_4_;
              if (fVar141 < auVar83._0_4_) {
                fVar211 = sqrtf(fVar141);
                auVar81 = ZEXT416((uint)local_800._0_4_);
                auVar82 = local_7e0._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(local_740._0_16_,local_740._0_16_);
                fVar211 = auVar82._0_4_;
                auVar82 = local_7e0._0_16_;
              }
              fVar141 = fVar198 * 1.5 + fVar141 * -0.5 * fVar198 * fVar198 * fVar198;
              auVar147._0_4_ = auVar82._0_4_ * fVar141;
              auVar147._4_4_ = auVar82._4_4_ * fVar141;
              auVar147._8_4_ = auVar82._8_4_ * fVar141;
              auVar147._12_4_ = auVar82._12_4_ * fVar141;
              auVar83 = vdpps_avx(local_8a0._0_16_,auVar147,0x7f);
              fVar213 = auVar81._0_4_;
              fVar198 = auVar83._0_4_;
              auVar148._0_4_ = fVar198 * fVar198;
              auVar148._4_4_ = auVar83._4_4_ * auVar83._4_4_;
              auVar148._8_4_ = auVar83._8_4_ * auVar83._8_4_;
              auVar148._12_4_ = auVar83._12_4_ * auVar83._12_4_;
              auVar84 = vsubps_avx512vl(local_8c0._0_16_,auVar148);
              fVar212 = auVar84._0_4_;
              auVar164._4_12_ = ZEXT812(0) << 0x20;
              auVar164._0_4_ = fVar212;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar164);
              auVar85 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              if (fVar212 < 0.0) {
                local_630 = fVar141;
                fStack_62c = fVar141;
                fStack_628 = fVar141;
                fStack_624 = fVar141;
                local_620 = auVar80;
                fVar222 = sqrtf(fVar212);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar81 = ZEXT416((uint)local_800._0_4_);
                auVar84 = local_620;
                auVar82 = local_7e0._0_16_;
                fVar141 = local_630;
                fVar212 = fStack_62c;
                fVar214 = fStack_628;
                fVar215 = fStack_624;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar222 = auVar84._0_4_;
                auVar84 = auVar80;
                fVar212 = fVar141;
                fVar214 = fVar141;
                fVar215 = fVar141;
              }
              auVar247 = ZEXT1664(local_8a0._0_16_);
              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar264 = ZEXT3264(auVar94);
              auVar254 = ZEXT3264(local_920);
              auVar255 = ZEXT3264(local_940);
              auVar256 = ZEXT3264(local_820);
              auVar257 = ZEXT3264(local_960);
              auVar258 = ZEXT3264(local_840);
              auVar259 = ZEXT3264(local_980);
              auVar260 = ZEXT3264(local_860);
              auVar261 = ZEXT3264(local_8e0);
              auVar262 = ZEXT3264(local_900);
              auVar263 = ZEXT3264(local_880);
              auVar165._0_4_ = (float)local_600._0_4_ * (float)local_700._0_4_;
              auVar165._4_4_ = (float)local_600._0_4_ * (float)local_700._4_4_;
              auVar165._8_4_ = (float)local_600._0_4_ * fStack_6f8;
              auVar165._12_4_ = (float)local_600._0_4_ * fStack_6f4;
              auVar185._4_4_ = local_5e0._0_4_;
              auVar185._0_4_ = local_5e0._0_4_;
              auVar185._8_4_ = local_5e0._0_4_;
              auVar185._12_4_ = local_5e0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar185,auVar165,local_6c0._0_16_);
              auVar166._4_4_ = local_5c0._0_4_;
              auVar166._0_4_ = local_5c0._0_4_;
              auVar166._8_4_ = local_5c0._0_4_;
              auVar166._12_4_ = local_5c0._0_4_;
              auVar238 = vfmadd132ps_fma(auVar166,auVar238,local_6e0._0_16_);
              auVar79 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar156 = auVar79._0_4_;
              auVar186._4_4_ = uVar156;
              auVar186._0_4_ = uVar156;
              auVar186._8_4_ = uVar156;
              auVar186._12_4_ = uVar156;
              auVar79 = vfmadd132ps_fma(auVar186,auVar238,local_6a0._0_16_);
              auVar167._0_4_ = auVar79._0_4_ * (float)local_740._0_4_;
              auVar167._4_4_ = auVar79._4_4_ * (float)local_740._0_4_;
              auVar167._8_4_ = auVar79._8_4_ * (float)local_740._0_4_;
              auVar167._12_4_ = auVar79._12_4_ * (float)local_740._0_4_;
              auVar79 = vdpps_avx(auVar82,auVar79,0x7f);
              fVar197 = auVar79._0_4_;
              auVar187._0_4_ = auVar82._0_4_ * fVar197;
              auVar187._4_4_ = auVar82._4_4_ * fVar197;
              auVar187._8_4_ = auVar82._8_4_ * fVar197;
              auVar187._12_4_ = auVar82._12_4_ * fVar197;
              auVar79 = vsubps_avx(auVar167,auVar187);
              fVar197 = (float)local_7c0._0_4_ * (float)local_760._0_4_;
              auVar238 = vmaxss_avx(ZEXT416((uint)fVar216),
                                    ZEXT416((uint)(local_680._0_4_ * fVar221 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar132._16_16_ = local_880._16_16_;
              auVar86 = vxorps_avx512vl(auVar82,auVar21);
              auVar188._0_4_ = fVar141 * auVar79._0_4_ * fVar197;
              auVar188._4_4_ = fVar212 * auVar79._4_4_ * fVar197;
              auVar188._8_4_ = fVar214 * auVar79._8_4_ * fVar197;
              auVar188._12_4_ = fVar215 * auVar79._12_4_ * fVar197;
              auVar248 = ZEXT1664(auVar147);
              auVar79 = vdpps_avx(auVar86,auVar147,0x7f);
              auVar1 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar216),auVar238);
              auVar81 = vdpps_avx(local_8a0._0_16_,auVar188,0x7f);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                       ZEXT416((uint)(fVar216 / fVar211)),auVar1);
              fVar141 = auVar79._0_4_ + auVar81._0_4_;
              auVar81 = vdpps_avx(local_710,auVar147,0x7f);
              auVar79 = vdpps_avx(local_8a0._0_16_,auVar86,0x7f);
              auVar85 = vmulss_avx512f(auVar85,auVar84);
              fVar211 = auVar80._0_4_ * 1.5 + auVar85._0_4_ * auVar84._0_4_ * auVar84._0_4_;
              auVar84 = vdpps_avx(local_8a0._0_16_,local_710,0x7f);
              auVar85 = vfnmadd231ss_fma(auVar79,auVar83,ZEXT416((uint)fVar141));
              auVar84 = vfnmadd231ss_fma(auVar84,auVar83,auVar81);
              auVar79 = vpermilps_avx(local_5a0._0_16_,0xff);
              fVar222 = fVar222 - auVar79._0_4_;
              auVar80 = vshufps_avx(auVar82,auVar82,0xff);
              auVar79 = vfmsub213ss_fma(auVar85,ZEXT416((uint)fVar211),auVar80);
              auVar240._8_4_ = 0x80000000;
              auVar240._0_8_ = 0x8000000080000000;
              auVar240._12_4_ = 0x80000000;
              auVar242 = ZEXT1664(auVar240);
              auVar234._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar234);
              auVar84 = ZEXT416((uint)(auVar84._0_4_ * fVar211));
              auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar141),auVar84);
              auVar79 = vinsertps_avx(auVar234,auVar84,0x1c);
              auVar227._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar81._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar84 = vinsertps_avx(ZEXT416((uint)fVar141),auVar227,0x10);
              auVar208._0_4_ = auVar85._0_4_;
              auVar208._4_4_ = auVar208._0_4_;
              auVar208._8_4_ = auVar208._0_4_;
              auVar208._12_4_ = auVar208._0_4_;
              auVar81 = vdivps_avx(auVar79,auVar208);
              auVar79 = vdivps_avx(auVar84,auVar208);
              auVar209._0_4_ = fVar198 * auVar81._0_4_ + fVar222 * auVar79._0_4_;
              auVar209._4_4_ = fVar198 * auVar81._4_4_ + fVar222 * auVar79._4_4_;
              auVar209._8_4_ = fVar198 * auVar81._8_4_ + fVar222 * auVar79._8_4_;
              auVar209._12_4_ = fVar198 * auVar81._12_4_ + fVar222 * auVar79._12_4_;
              auVar81 = vsubps_avx(local_680._0_16_,auVar209);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(auVar83,auVar22);
              fVar141 = (float)local_9a0._0_4_;
              fVar198 = (float)local_9a0._4_4_;
              fVar211 = fStack_998;
              fVar212 = fStack_994;
              fVar213 = fStack_990;
              fVar214 = fStack_98c;
              fVar215 = fStack_988;
              fVar197 = fStack_984;
              if (auVar79._0_4_ < auVar1._0_4_) {
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar238._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(ZEXT416((uint)fVar222),auVar23);
                if (auVar83._0_4_ < auVar79._0_4_) {
                  fVar221 = auVar81._0_4_ + (float)local_650._0_4_;
                  if (fVar221 < fVar140) {
                    bVar66 = 0;
                    goto LAB_01d139c5;
                  }
                  fVar222 = *(float *)(ray + k * 4 + 0x80);
                  auVar236 = ZEXT464((uint)fVar222);
                  auVar232 = ZEXT3264(_local_780);
                  if (fVar221 <= fVar222) {
                    auVar79 = vmovshdup_avx(auVar81);
                    bVar66 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_01d139ce;
                    auVar210._0_12_ = ZEXT812(0);
                    auVar210._12_4_ = 0;
                    auVar132._0_16_ = auVar210;
                    auVar131._4_28_ = auVar132._4_28_;
                    auVar131._0_4_ = local_8c0._0_4_;
                    auVar79 = vrsqrt14ss_avx512f(auVar210,auVar131._0_16_);
                    fVar223 = auVar79._0_4_;
                    auVar79 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar74].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar66 = 0;
                      goto LAB_01d139ce;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar66 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01d139ce;
                    fVar223 = fVar223 * 1.5 + auVar79._0_4_ * fVar223 * fVar223 * fVar223;
                    auVar189._0_4_ = local_8a0._0_4_ * fVar223;
                    auVar189._4_4_ = local_8a0._4_4_ * fVar223;
                    auVar189._8_4_ = local_8a0._8_4_ * fVar223;
                    auVar189._12_4_ = local_8a0._12_4_ * fVar223;
                    auVar84 = vfmadd213ps_fma(auVar80,auVar189,auVar82);
                    auVar79 = vshufps_avx(auVar189,auVar189,0xc9);
                    auVar83 = vshufps_avx(auVar82,auVar82,0xc9);
                    auVar190._0_4_ = auVar189._0_4_ * auVar83._0_4_;
                    auVar190._4_4_ = auVar189._4_4_ * auVar83._4_4_;
                    auVar190._8_4_ = auVar189._8_4_ * auVar83._8_4_;
                    auVar190._12_4_ = auVar189._12_4_ * auVar83._12_4_;
                    auVar83 = vfmsub231ps_fma(auVar190,auVar82,auVar79);
                    auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar79 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                    auVar149._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                    auVar149._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                    auVar149._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                    auVar149._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                    auVar82 = vfmsub231ps_fma(auVar149,auVar82,auVar79);
                    local_510 = vshufps_avx(auVar81,auVar81,0x55);
                    local_540 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                    auStack_530 = vshufps_avx(auVar82,auVar82,0xaa);
                    local_520 = auVar82._0_4_;
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    local_500 = ZEXT416(0) << 0x20;
                    local_4f0 = local_550._0_8_;
                    uStack_4e8 = local_550._8_8_;
                    local_4e0 = local_560;
                    vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                    uStack_4cc = context->user->instID[0];
                    local_4d0 = uStack_4cc;
                    uStack_4c8 = uStack_4cc;
                    uStack_4c4 = uStack_4cc;
                    uStack_4c0 = context->user->instPrimID[0];
                    uStack_4bc = uStack_4c0;
                    uStack_4b8 = uStack_4c0;
                    uStack_4b4 = uStack_4c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar221;
                    local_9c0 = local_570;
                    local_7b0.valid = (int *)local_9c0;
                    local_7b0.geometryUserPtr = pGVar3->userPtr;
                    local_7b0.context = context->user;
                    local_7b0.hit = local_540;
                    local_7b0.N = 4;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar242 = ZEXT1664(auVar240);
                      auVar247 = ZEXT1664(local_8a0._0_16_);
                      auVar248 = ZEXT1664(auVar147);
                      (*pGVar3->occlusionFilterN)(&local_7b0);
                      auVar232 = ZEXT3264(_local_780);
                      auVar263 = ZEXT3264(local_880);
                      auVar262 = ZEXT3264(local_900);
                      auVar261 = ZEXT3264(local_8e0);
                      auVar260 = ZEXT3264(local_860);
                      auVar259 = ZEXT3264(local_980);
                      auVar258 = ZEXT3264(local_840);
                      auVar257 = ZEXT3264(local_960);
                      auVar256 = ZEXT3264(local_820);
                      auVar255 = ZEXT3264(local_940);
                      auVar254 = ZEXT3264(local_920);
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar264 = ZEXT3264(auVar94);
                      fVar141 = (float)local_9a0._0_4_;
                      fVar198 = (float)local_9a0._4_4_;
                      fVar211 = fStack_998;
                      fVar212 = fStack_994;
                      fVar213 = fStack_990;
                      fVar214 = fStack_98c;
                      fVar215 = fStack_988;
                      fVar197 = fStack_984;
                    }
                    uVar76 = vptestmd_avx512vl(local_9c0,local_9c0);
                    if ((uVar76 & 0xf) != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        (*p_Var4)(&local_7b0);
                        auVar232 = ZEXT3264(_local_780);
                        auVar263 = ZEXT3264(local_880);
                        auVar262 = ZEXT3264(local_900);
                        auVar261 = ZEXT3264(local_8e0);
                        auVar260 = ZEXT3264(local_860);
                        auVar259 = ZEXT3264(local_980);
                        auVar258 = ZEXT3264(local_840);
                        auVar257 = ZEXT3264(local_960);
                        auVar256 = ZEXT3264(local_820);
                        auVar255 = ZEXT3264(local_940);
                        auVar254 = ZEXT3264(local_920);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar264 = ZEXT3264(auVar94);
                        fVar141 = (float)local_9a0._0_4_;
                        fVar198 = (float)local_9a0._4_4_;
                        fVar211 = fStack_998;
                        fVar212 = fStack_994;
                        fVar213 = fStack_990;
                        fVar214 = fStack_98c;
                        fVar215 = fStack_988;
                        fVar197 = fStack_984;
                      }
                      auVar236 = ZEXT464((uint)fVar222);
                      uVar76 = vptestmd_avx512vl(local_9c0,local_9c0);
                      uVar76 = uVar76 & 0xf;
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar5 = (bool)((byte)uVar76 & 1);
                      auVar87._0_4_ =
                           (uint)bVar5 * auVar81._0_4_ |
                           (uint)!bVar5 * *(int *)(local_7b0.ray + 0x80);
                      bVar5 = (bool)((byte)(uVar76 >> 1) & 1);
                      auVar87._4_4_ =
                           (uint)bVar5 * auVar81._4_4_ |
                           (uint)!bVar5 * *(int *)(local_7b0.ray + 0x84);
                      bVar5 = (bool)((byte)(uVar76 >> 2) & 1);
                      auVar87._8_4_ =
                           (uint)bVar5 * auVar81._8_4_ |
                           (uint)!bVar5 * *(int *)(local_7b0.ray + 0x88);
                      bVar5 = SUB81(uVar76 >> 3,0);
                      auVar87._12_4_ =
                           (uint)bVar5 * auVar81._12_4_ |
                           (uint)!bVar5 * *(int *)(local_7b0.ray + 0x8c);
                      *(undefined1 (*) [16])(local_7b0.ray + 0x80) = auVar87;
                      bVar66 = 1;
                      if ((byte)uVar76 != 0) goto LAB_01d139ce;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar222;
                  }
                  auVar236 = ZEXT464((uint)fVar222);
                  bVar66 = 0;
                  goto LAB_01d139ce;
                }
              }
              bVar75 = uVar76 < 4;
              uVar76 = uVar76 + 1;
            } while (uVar76 != 5);
            bVar75 = false;
            bVar66 = 5;
LAB_01d139c5:
            auVar232 = ZEXT3264(_local_780);
LAB_01d139ce:
            bVar73 = (bool)(bVar73 | bVar75 & bVar66);
            uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar154._4_4_ = uVar156;
            auVar154._0_4_ = uVar156;
            auVar154._8_4_ = uVar156;
            auVar154._12_4_ = uVar156;
            auVar154._16_4_ = uVar156;
            auVar154._20_4_ = uVar156;
            auVar154._24_4_ = uVar156;
            auVar154._28_4_ = uVar156;
            auVar62._4_4_ = fStack_41c;
            auVar62._0_4_ = local_420;
            auVar62._8_4_ = fStack_418;
            auVar62._12_4_ = fStack_414;
            auVar62._16_4_ = fStack_410;
            auVar62._20_4_ = fStack_40c;
            auVar62._24_4_ = fStack_408;
            auVar62._28_4_ = fStack_404;
            uVar12 = vcmpps_avx512vl(auVar154,auVar62,0xd);
            bVar68 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar68 & (byte)uVar12;
            auVar129 = local_440;
          } while (bVar68 != 0);
        }
        uVar13 = vpcmpgtd_avx512vl(auVar129,local_3e0);
        uVar14 = vpcmpd_avx512vl(local_3e0,local_360,1);
        auVar195._0_4_ = fVar141 + (float)local_1c0._0_4_;
        auVar195._4_4_ = fVar198 + (float)local_1c0._4_4_;
        auVar195._8_4_ = fVar211 + fStack_1b8;
        auVar195._12_4_ = fVar212 + fStack_1b4;
        auVar195._16_4_ = fVar213 + fStack_1b0;
        auVar195._20_4_ = fVar214 + fStack_1ac;
        auVar195._24_4_ = fVar215 + fStack_1a8;
        auVar195._28_4_ = fVar197 + fStack_1a4;
        uVar12 = vcmpps_avx512vl(auVar195,auVar154,2);
        bVar68 = (byte)local_9ac & (byte)uVar14 & (byte)uVar12;
        auVar196._0_4_ = fVar141 + local_3c0._0_4_;
        auVar196._4_4_ = fVar198 + local_3c0._4_4_;
        auVar196._8_4_ = fVar211 + local_3c0._8_4_;
        auVar196._12_4_ = fVar212 + local_3c0._12_4_;
        auVar196._16_4_ = fVar213 + local_3c0._16_4_;
        auVar196._20_4_ = fVar214 + local_3c0._20_4_;
        auVar196._24_4_ = fVar215 + local_3c0._24_4_;
        auVar196._28_4_ = fVar197 + local_3c0._28_4_;
        uVar12 = vcmpps_avx512vl(auVar196,auVar154,2);
        bVar64 = bVar64 & (byte)uVar13 & (byte)uVar12 | bVar68;
        prim = local_610;
        if (bVar64 != 0) {
          uVar77 = (ulong)uVar70;
          abStack_180[uVar77 * 0x60] = bVar64;
          auVar133._0_4_ =
               (uint)(bVar68 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar68 & 1) * (int)local_3c0._0_4_;
          bVar75 = (bool)(bVar68 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar75 * local_1c0._4_4_ | (uint)!bVar75 * (int)local_3c0._4_4_;
          bVar75 = (bool)(bVar68 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar75 * (int)fStack_1b8 | (uint)!bVar75 * (int)local_3c0._8_4_;
          bVar75 = (bool)(bVar68 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar75 * (int)fStack_1b4 | (uint)!bVar75 * (int)local_3c0._12_4_;
          bVar75 = (bool)(bVar68 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar75 * (int)fStack_1b0 | (uint)!bVar75 * (int)local_3c0._16_4_;
          bVar75 = (bool)(bVar68 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar75 * (int)fStack_1ac | (uint)!bVar75 * (int)local_3c0._20_4_;
          bVar75 = (bool)(bVar68 >> 6 & 1);
          auVar133._24_4_ = (uint)bVar75 * (int)fStack_1a8 | (uint)!bVar75 * (int)local_3c0._24_4_;
          auVar133._28_4_ =
               (uint)(bVar68 >> 7) * (int)fStack_1a4 |
               (uint)!(bool)(bVar68 >> 7) * (int)local_3c0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar77 * 0x60) = auVar133;
          uVar76 = vmovlps_avx(local_3f0);
          (&uStack_140)[uVar77 * 0xc] = uVar76;
          aiStack_138[uVar77 * 0x18] = local_a3c + 1;
          uVar70 = uVar70 + 1;
        }
      }
    }
    do {
      uVar78 = uVar70;
      uVar71 = uVar78 - 1;
      if (uVar78 == 0) {
        if (bVar73 != false) {
          return bVar73;
        }
        uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar35._4_4_ = uVar156;
        auVar35._0_4_ = uVar156;
        auVar35._8_4_ = uVar156;
        auVar35._12_4_ = uVar156;
        auVar35._16_4_ = uVar156;
        auVar35._20_4_ = uVar156;
        auVar35._24_4_ = uVar156;
        auVar35._28_4_ = uVar156;
        uVar12 = vcmpps_avx512vl(local_340,auVar35,2);
        uVar74 = (uint)local_608 & (uint)uVar12;
        local_608 = (ulong)uVar74;
        if (uVar74 == 0) {
          return false;
        }
        goto LAB_01d114d4;
      }
      uVar76 = (ulong)uVar71;
      lVar69 = uVar76 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar69);
      auVar169._0_4_ = fVar141 + auVar94._0_4_;
      auVar169._4_4_ = fVar198 + auVar94._4_4_;
      auVar169._8_4_ = fVar211 + auVar94._8_4_;
      auVar169._12_4_ = fVar212 + auVar94._12_4_;
      auVar169._16_4_ = fVar213 + auVar94._16_4_;
      auVar169._20_4_ = fVar214 + auVar94._20_4_;
      auVar169._24_4_ = fVar215 + auVar94._24_4_;
      auVar169._28_4_ = fVar197 + auVar94._28_4_;
      uVar156 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar34._4_4_ = uVar156;
      auVar34._0_4_ = uVar156;
      auVar34._8_4_ = uVar156;
      auVar34._12_4_ = uVar156;
      auVar34._16_4_ = uVar156;
      auVar34._20_4_ = uVar156;
      auVar34._24_4_ = uVar156;
      auVar34._28_4_ = uVar156;
      uVar12 = vcmpps_avx512vl(auVar169,auVar34,2);
      uVar67 = (uint)uVar12 & (uint)abStack_180[lVar69];
      uVar70 = uVar71;
    } while (uVar67 == 0);
    uVar77 = (&uStack_140)[uVar76 * 0xc];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar77;
    auVar194._8_4_ = 0x7f800000;
    auVar194._0_8_ = 0x7f8000007f800000;
    auVar194._12_4_ = 0x7f800000;
    auVar194._16_4_ = 0x7f800000;
    auVar194._20_4_ = 0x7f800000;
    auVar194._24_4_ = 0x7f800000;
    auVar194._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar194,auVar94);
    bVar64 = (byte)uVar67;
    auVar125._0_4_ =
         (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)auVar94._0_4_;
    bVar75 = (bool)((byte)(uVar67 >> 1) & 1);
    auVar125._4_4_ = (uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * (int)auVar94._4_4_;
    bVar75 = (bool)((byte)(uVar67 >> 2) & 1);
    auVar125._8_4_ = (uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * (int)auVar94._8_4_;
    bVar75 = (bool)((byte)(uVar67 >> 3) & 1);
    auVar125._12_4_ = (uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * (int)auVar94._12_4_;
    bVar75 = (bool)((byte)(uVar67 >> 4) & 1);
    auVar125._16_4_ = (uint)bVar75 * auVar91._16_4_ | (uint)!bVar75 * (int)auVar94._16_4_;
    bVar75 = (bool)((byte)(uVar67 >> 5) & 1);
    auVar125._20_4_ = (uint)bVar75 * auVar91._20_4_ | (uint)!bVar75 * (int)auVar94._20_4_;
    bVar75 = (bool)((byte)(uVar67 >> 6) & 1);
    auVar125._24_4_ = (uint)bVar75 * auVar91._24_4_ | (uint)!bVar75 * (int)auVar94._24_4_;
    auVar125._28_4_ =
         (uVar67 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar67 >> 7,0) * (int)auVar94._28_4_;
    auVar94 = vshufps_avx(auVar125,auVar125,0xb1);
    auVar94 = vminps_avx(auVar125,auVar94);
    auVar91 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar91);
    auVar91 = vpermpd_avx2(auVar94,0x4e);
    auVar94 = vminps_avx(auVar94,auVar91);
    uVar12 = vcmpps_avx512vl(auVar125,auVar94,0);
    bVar68 = (byte)uVar12 & bVar64;
    if (bVar68 != 0) {
      uVar67 = (uint)bVar68;
    }
    uVar134 = 0;
    for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
      uVar134 = uVar134 + 1;
    }
    local_a3c = aiStack_138[uVar76 * 0x18];
    bVar64 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar64;
    abStack_180[lVar69] = bVar64;
    uVar70 = uVar78;
    if (bVar64 == 0) {
      uVar70 = uVar71;
    }
    uVar156 = (undefined4)uVar77;
    auVar151._4_4_ = uVar156;
    auVar151._0_4_ = uVar156;
    auVar151._8_4_ = uVar156;
    auVar151._12_4_ = uVar156;
    auVar151._16_4_ = uVar156;
    auVar151._20_4_ = uVar156;
    auVar151._24_4_ = uVar156;
    auVar151._28_4_ = uVar156;
    auVar81 = vmovshdup_avx(auVar157);
    auVar81 = vsubps_avx(auVar81,auVar157);
    auVar170._0_4_ = auVar81._0_4_;
    auVar170._4_4_ = auVar170._0_4_;
    auVar170._8_4_ = auVar170._0_4_;
    auVar170._12_4_ = auVar170._0_4_;
    auVar170._16_4_ = auVar170._0_4_;
    auVar170._20_4_ = auVar170._0_4_;
    auVar170._24_4_ = auVar170._0_4_;
    auVar170._28_4_ = auVar170._0_4_;
    auVar81 = vfmadd132ps_fma(auVar170,auVar151,_DAT_01faff20);
    _local_540 = ZEXT1632(auVar81);
    local_3f0._8_8_ = 0;
    local_3f0._0_8_ = *(ulong *)(local_540 + (ulong)uVar134 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }